

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_compute_forward(ggml_compute_params *params,ggml_tensor *tensor)

{
  ggml_type gVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  void *pvVar17;
  uint *puVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  _Bool _Var24;
  int i_3;
  uint uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  byte *pbVar32;
  float *pfVar33;
  int i_1;
  undefined4 uVar34;
  ulong uVar35;
  undefined8 uVar36;
  int j_1;
  int iVar37;
  undefined4 *puVar38;
  int i01;
  uint uVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  void *pvVar44;
  int i0_1;
  undefined8 unaff_RBP;
  float *pfVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  undefined7 uVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  undefined2 *puVar54;
  int j;
  int iVar55;
  ulong uVar56;
  char *pcVar57;
  int i_7;
  uint uVar58;
  ulong uVar59;
  undefined4 *puVar60;
  int i;
  long lVar61;
  ulong in_R11;
  uint8_t *pd;
  undefined2 *puVar62;
  int ik3_2;
  int iVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  ulong uVar67;
  ulong uVar68;
  int i1;
  ulong uVar69;
  ggml_fp16_t *pgVar70;
  int ik1;
  ulong uVar71;
  int k;
  ulong uVar72;
  long lVar73;
  float *pfVar74;
  ulong uVar75;
  long lVar76;
  byte *pbVar77;
  bool bVar78;
  float fVar79;
  undefined8 in_XMM0_Qa;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  double dVar80;
  double dVar81;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 in_register_00001444 [12];
  int local_198;
  int i1_2;
  int local_188;
  int local_180;
  long local_178;
  int i1_4;
  int local_168;
  int local_160;
  int local_158;
  int i1_3;
  int ik2_2;
  long local_140;
  int local_138;
  int ib02;
  long local_128;
  int i2_1;
  int ik3;
  int i2;
  long local_108;
  long local_100;
  long local_f8;
  int local_f0;
  int local_e8;
  int i3;
  int local_d8;
  int i03_2;
  int local_c8;
  float max;
  int local_b8;
  undefined4 uStack_b4;
  ulong local_b0;
  int i3_1;
  undefined4 uStack_a4;
  float local_a0;
  undefined4 uStack_9c;
  double local_98 [5];
  ulong local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  undefined1 extraout_var [56];
  
  if (params == (ggml_compute_params *)0x0) {
    pcVar57 = "params";
    uVar36 = 0x2176;
    goto LAB_00121356;
  }
  switch(tensor->op) {
  case GGML_OP_DUP:
  case GGML_OP_CPY:
    ggml_compute_forward_dup(params,tensor->src0,tensor);
    return;
  case GGML_OP_ADD:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      pgVar5 = tensor->src1;
      _Var24 = ggml_are_same_shape(pgVar7,pgVar5);
      if ((_Var24) && (_Var24 = ggml_are_same_shape(pgVar7,tensor), _Var24)) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        if (tensor->nb[0] == 4) {
          if (pgVar7->nb[0] == 4) {
            iVar27 = params->ith;
            lVar61 = (long)iVar27;
            iVar52 = params->nth;
            lVar66 = (long)iVar52;
            uVar56 = (long)pgVar7->ne[3] * (long)pgVar7->ne[2] * (long)pgVar7->ne[1];
            uVar25 = pgVar7->ne[0];
            sVar11 = pgVar7->nb[1];
            sVar12 = pgVar5->nb[0];
            sVar13 = pgVar5->nb[1];
            sVar14 = tensor->nb[1];
            if (sVar12 == 4) {
              iVar29 = (int)((long)((ulong)(uint)((int)uVar56 >> 0x1f) << 0x20 | uVar56 & 0xffffffff
                                   ) / (long)iVar52);
              iVar51 = (iVar27 + 1) * iVar29;
              if (iVar27 == iVar52 + -1) {
                iVar51 = (int)uVar56;
              }
              lVar66 = (long)(iVar29 * iVar27);
              lVar73 = sVar13 * lVar66;
              lVar61 = sVar11 * lVar66;
              lVar65 = sVar14 * lVar66;
              for (; lVar66 < iVar51; lVar66 = lVar66 + 1) {
                ggml_vec_add_f32(uVar25,(float *)((long)tensor->data + lVar65),
                                 (float *)((long)pgVar7->data + lVar61),
                                 (float *)((long)pgVar5->data + lVar73));
                lVar73 = lVar73 + sVar13;
                lVar61 = lVar61 + sVar11;
                lVar65 = lVar65 + sVar14;
              }
              return;
            }
            if ((int)uVar25 < 1) {
              uVar25 = 0;
            }
            lVar73 = sVar14 * lVar61;
            lVar65 = sVar11 * lVar61;
            lVar43 = sVar13 * lVar61;
            for (; lVar61 < (long)uVar56; lVar61 = lVar61 + lVar66) {
              pvVar44 = tensor->data;
              pvVar10 = pgVar7->data;
              lVar46 = lVar43;
              for (uVar71 = 0; uVar25 != uVar71; uVar71 = uVar71 + 1) {
                *(float *)((long)pvVar44 + uVar71 * 4 + lVar73) =
                     *(float *)((long)pvVar10 + uVar71 * 4 + lVar65) +
                     *(float *)((long)pgVar5->data + lVar46);
                lVar46 = lVar46 + sVar12;
              }
              lVar73 = lVar73 + sVar14 * lVar66;
              lVar65 = lVar65 + sVar11 * lVar66;
              lVar43 = lVar43 + sVar13 * lVar66;
            }
            return;
          }
          pcVar57 = "nb00 == sizeof(float)";
          uVar36 = 0x1187;
        }
        else {
          pcVar57 = "nb0 == sizeof(float)";
          uVar36 = 0x1186;
        }
      }
      else {
        pcVar57 = "ggml_are_same_shape(src0, src1) && ggml_are_same_shape(src0, dst)";
        uVar36 = 0x1171;
      }
    }
    else {
      if ((GGML_TYPE_F16 < gVar1) && (gVar1 != GGML_TYPE_COUNT)) {
        return;
      }
      pcVar57 = "false";
      uVar36 = 0x11b3;
    }
    goto LAB_00121356;
  case GGML_OP_SUB:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        pgVar5 = tensor->src1;
        iVar27 = pgVar7->ne[0];
        uVar25 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        uVar71 = 0;
        uVar56 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar56 = uVar71;
        }
        for (; uVar56 != uVar71; uVar71 = uVar71 + 1) {
          ggml_vec_sub_f32(iVar27,(float *)(tensor->nb[1] * uVar71 + (long)tensor->data),
                           (float *)(pgVar7->nb[1] * uVar71 + (long)pgVar7->data),
                           (float *)(pgVar5->nb[1] * uVar71 + (long)pgVar5->data));
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x11e7;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_MUL:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        uVar25 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        uVar71 = 0;
        uVar56 = (ulong)(uint)pgVar7->ne[0];
        if (pgVar7->ne[0] < 1) {
          uVar56 = uVar71;
        }
        pgVar5 = tensor->src1;
        uVar31 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar31 = uVar71;
        }
        for (; uVar71 != uVar31; uVar71 = uVar71 + 1) {
          sVar11 = pgVar5->nb[1];
          pvVar44 = pgVar5->data;
          sVar12 = tensor->nb[1];
          pvVar10 = tensor->data;
          sVar13 = pgVar7->nb[1];
          pvVar17 = pgVar7->data;
          for (uVar59 = 0; uVar56 != uVar59; uVar59 = uVar59 + 1) {
            *(float *)((long)pvVar10 + uVar59 * 4 + sVar12 * uVar71) =
                 *(float *)((long)pvVar17 + uVar59 * 4 + sVar13 * uVar71) *
                 *(float *)((long)pvVar44 + uVar59 * 4 + sVar11 * uVar71);
          }
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x121b;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_DIV:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        pgVar5 = tensor->src1;
        iVar27 = pgVar7->ne[0];
        uVar25 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        uVar71 = 0;
        uVar56 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar56 = uVar71;
        }
        for (; uVar56 != uVar71; uVar71 = uVar71 + 1) {
          ggml_vec_div_f32(iVar27,(float *)(tensor->nb[1] * uVar71 + (long)tensor->data),
                           (float *)(pgVar7->nb[1] * uVar71 + (long)pgVar7->data),
                           (float *)(pgVar5->nb[1] * uVar71 + (long)pgVar5->data));
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x124f;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_SQR:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        iVar27 = pgVar7->ne[0];
        uVar25 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        uVar71 = 0;
        uVar56 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar56 = uVar71;
        }
        for (; uVar56 != uVar71; uVar71 = uVar71 + 1) {
          ggml_vec_sqr_f32(iVar27,(float *)(tensor->nb[1] * uVar71 + (long)tensor->data),
                           (float *)(pgVar7->nb[1] * uVar71 + (long)pgVar7->data));
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x127f;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_SQRT:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        iVar27 = pgVar7->ne[0];
        uVar25 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        uVar71 = 0;
        uVar56 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar56 = uVar71;
        }
        for (; uVar56 != uVar71; uVar71 = uVar71 + 1) {
          ggml_vec_sqrt_f32(iVar27,(float *)(tensor->nb[1] * uVar71 + (long)tensor->data),
                            (float *)(pgVar7->nb[1] * uVar71 + (long)pgVar7->data));
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x12af;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_SUM:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        iVar27 = pgVar7->ne[0];
        sVar11 = pgVar7->nb[1];
        sVar12 = pgVar7->nb[2];
        uVar71 = 0;
        uVar56 = (ulong)(uint)pgVar7->ne[1];
        if (pgVar7->ne[1] < 1) {
          uVar56 = uVar71;
        }
        sVar13 = pgVar7->nb[3];
        uVar31 = (ulong)(uint)pgVar7->ne[2];
        if (pgVar7->ne[2] < 1) {
          uVar31 = uVar71;
        }
        uVar59 = (ulong)(uint)pgVar7->ne[3];
        if (pgVar7->ne[3] < 1) {
          uVar59 = uVar71;
        }
        for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
          uVar35 = uVar71;
          for (uVar72 = 0; uVar67 = uVar35, uVar75 = uVar56, uVar72 != uVar31; uVar72 = uVar72 + 1)
          {
            while (bVar78 = uVar75 != 0, uVar75 = uVar75 - 1, bVar78) {
              ggml_vec_sum_f32(iVar27,(float *)tensor->data,(float *)((long)pgVar7->data + uVar67));
              uVar67 = uVar67 + sVar11;
            }
            uVar35 = uVar35 + sVar12;
          }
          uVar71 = uVar71 + sVar13;
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x12e9;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_MEAN:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        iVar27 = pgVar7->ne[0];
        sVar11 = pgVar7->nb[1];
        sVar12 = pgVar7->nb[2];
        sVar13 = pgVar7->nb[3];
        sVar14 = tensor->nb[1];
        sVar15 = tensor->nb[2];
        sVar16 = tensor->nb[3];
        uVar71 = 0;
        uVar56 = (ulong)(uint)pgVar7->ne[1];
        if (pgVar7->ne[1] < 1) {
          uVar56 = uVar71;
        }
        uVar31 = (ulong)(uint)pgVar7->ne[2];
        if (pgVar7->ne[2] < 1) {
          uVar31 = uVar71;
        }
        uVar59 = (ulong)(uint)pgVar7->ne[3];
        if (pgVar7->ne[3] < 1) {
          uVar59 = uVar71;
        }
        lVar66 = 0;
        for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
          lVar61 = lVar66;
          uVar35 = uVar71;
          for (uVar72 = 0; uVar67 = uVar56, lVar73 = lVar61, uVar75 = uVar35, uVar72 != uVar31;
              uVar72 = uVar72 + 1) {
            while (bVar78 = uVar67 != 0, uVar67 = uVar67 - 1, bVar78) {
              ggml_vec_sum_f32(iVar27,(float *)((long)tensor->data + uVar75),
                               (float *)((long)pgVar7->data + lVar73));
              *(float *)((long)tensor->data + uVar75) =
                   *(float *)((long)tensor->data + uVar75) / (float)iVar27;
              lVar73 = lVar73 + sVar11;
              uVar75 = uVar75 + sVar14;
            }
            lVar61 = lVar61 + sVar12;
            uVar35 = uVar35 + sVar15;
          }
          lVar66 = lVar66 + sVar13;
          uVar71 = uVar71 + sVar16;
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x1336;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_REPEAT:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        iVar27 = pgVar7->ne[0];
        uVar25 = pgVar7->ne[1];
        uVar56 = (long)tensor->ne[0] / (long)iVar27;
        uVar71 = (long)tensor->ne[1] / (long)(int)uVar25;
        uVar59 = 0;
        uVar31 = 0;
        if (0 < (int)uVar25) {
          uVar31 = (ulong)uVar25;
        }
        uVar47 = uVar56 & 0xffffffff;
        if ((int)uVar56 < 1) {
          uVar47 = uVar59;
        }
        uVar56 = uVar71 & 0xffffffff;
        if ((int)uVar71 < 1) {
          uVar56 = uVar59;
        }
        for (uVar71 = 0; uVar71 != uVar56; uVar71 = uVar71 + 1) {
          for (uVar35 = 0; uVar35 != uVar47; uVar35 = uVar35 + 1) {
            for (uVar72 = 0; uVar31 != uVar72; uVar72 = uVar72 + 1) {
              ggml_vec_cpy_f32(iVar27,(float *)((long)tensor->data +
                                               tensor->nb[0] * uVar35 * (long)iVar27 +
                                               (uVar72 + uVar59) * tensor->nb[1]),
                               (float *)(pgVar7->nb[1] * uVar72 + (long)pgVar7->data));
            }
          }
          uVar59 = uVar59 + (long)(int)uVar25;
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x1376;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_ABS:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        uVar25 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        uVar71 = 0;
        uVar56 = (ulong)(uint)pgVar7->ne[0];
        if (pgVar7->ne[0] < 1) {
          uVar56 = uVar71;
        }
        uVar31 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar31 = uVar71;
        }
        auVar85._8_4_ = 0x7fffffff;
        auVar85._0_8_ = 0x7fffffff7fffffff;
        auVar85._12_4_ = 0x7fffffff;
        for (; uVar71 != uVar31; uVar71 = uVar71 + 1) {
          sVar11 = tensor->nb[1];
          pvVar44 = tensor->data;
          sVar12 = pgVar7->nb[1];
          pvVar10 = pgVar7->data;
          for (uVar59 = 0; uVar56 != uVar59; uVar59 = uVar59 + 1) {
            auVar102 = vandpd_avx(ZEXT416(*(uint *)((long)pvVar10 + uVar59 * 4 + sVar12 * uVar71)),
                                  auVar85);
            *(int *)((long)pvVar44 + uVar59 * 4 + sVar11 * uVar71) = auVar102._0_4_;
          }
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x13a6;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_SGN:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        uVar25 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        uVar71 = 0;
        uVar56 = (ulong)(uint)pgVar7->ne[0];
        if (pgVar7->ne[0] < 1) {
          uVar56 = uVar71;
        }
        uVar31 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar31 = uVar71;
        }
        auVar86._0_12_ = ZEXT812(0);
        auVar86._12_4_ = 0;
        auVar101._8_4_ = 0x3f800000;
        auVar101._0_8_ = 0x3f8000003f800000;
        auVar101._12_4_ = 0x3f800000;
        for (; uVar71 != uVar31; uVar71 = uVar71 + 1) {
          sVar11 = tensor->nb[1];
          pvVar44 = tensor->data;
          sVar12 = pgVar7->nb[1];
          pvVar10 = pgVar7->data;
          for (uVar59 = 0; uVar56 != uVar59; uVar59 = uVar59 + 1) {
            auVar83 = ZEXT416(*(uint *)((long)pvVar10 + uVar59 * 4 + sVar12 * uVar71));
            auVar102 = vcmpss_avx(auVar83,auVar86,1);
            auVar102 = vandps_avx(auVar102,SUB6416(ZEXT464(0xbf800000),0));
            auVar83 = vcmpss_avx(auVar86,auVar83,1);
            auVar102 = vblendvps_avx(auVar102,auVar101,auVar83);
            *(int *)((long)pvVar44 + uVar59 * 4 + sVar11 * uVar71) = auVar102._0_4_;
          }
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x13d6;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_NEG:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        iVar27 = pgVar7->ne[0];
        uVar25 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        uVar71 = 0;
        uVar56 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar56 = uVar71;
        }
        for (; uVar56 != uVar71; uVar71 = uVar71 + 1) {
          ggml_vec_neg_f32(iVar27,(float *)(tensor->nb[1] * uVar71 + (long)tensor->data),
                           (float *)(pgVar7->nb[1] * uVar71 + (long)pgVar7->data));
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x1406;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_STEP:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        uVar25 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        uVar71 = 0;
        uVar56 = (ulong)(uint)pgVar7->ne[0];
        if (pgVar7->ne[0] < 1) {
          uVar56 = uVar71;
        }
        uVar31 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar31 = uVar71;
        }
        for (; uVar71 != uVar31; uVar71 = uVar71 + 1) {
          sVar11 = tensor->nb[1];
          pvVar44 = tensor->data;
          sVar12 = pgVar7->nb[1];
          pvVar10 = pgVar7->data;
          for (uVar59 = 0; uVar56 != uVar59; uVar59 = uVar59 + 1) {
            auVar102 = vcmpss_avx(ZEXT816(0),
                                  ZEXT416(*(uint *)((long)pvVar10 + uVar59 * 4 + sVar12 * uVar71)),1
                                 );
            auVar102 = vandps_avx(auVar102,SUB6416(ZEXT464(0x3f800000),0));
            *(int *)((long)pvVar44 + uVar59 * 4 + sVar11 * uVar71) = auVar102._0_4_;
          }
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x1436;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_RELU:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        uVar25 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
        uVar71 = 0;
        uVar56 = (ulong)(uint)pgVar7->ne[0];
        if (pgVar7->ne[0] < 1) {
          uVar56 = uVar71;
        }
        uVar31 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar31 = uVar71;
        }
        for (; uVar71 != uVar31; uVar71 = uVar71 + 1) {
          sVar11 = tensor->nb[1];
          pvVar44 = tensor->data;
          sVar12 = pgVar7->nb[1];
          pvVar10 = pgVar7->data;
          for (uVar59 = 0; uVar56 != uVar59; uVar59 = uVar59 + 1) {
            auVar102 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar10 + uVar59 * 4 + sVar12 * uVar71)),
                                  ZEXT816(0));
            *(int *)((long)pvVar44 + uVar59 * 4 + sVar11 * uVar71) = auVar102._0_4_;
          }
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x1466;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_GELU:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      _Var24 = ggml_is_contiguous(pgVar7);
      if (_Var24) {
        _Var24 = ggml_is_contiguous(tensor);
        if (_Var24) {
          _Var24 = ggml_are_same_shape(pgVar7,tensor);
          if (_Var24) {
            if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
              return;
            }
            iVar52 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
            iVar27 = (params->nth + iVar52 + -1) / params->nth;
            lVar66 = (long)params->ith * (long)iVar27;
            iVar27 = iVar27 + (int)lVar66;
            if (iVar52 <= iVar27) {
              iVar27 = iVar52;
            }
            uVar25 = pgVar7->ne[0];
            if (pgVar7->ne[0] < 1) {
              uVar25 = 0;
            }
            for (; lVar66 < iVar27; lVar66 = lVar66 + 1) {
              sVar11 = tensor->nb[1];
              pvVar44 = tensor->data;
              sVar12 = pgVar7->nb[1];
              pvVar10 = pgVar7->data;
              for (uVar56 = 0; uVar25 != uVar56; uVar56 = uVar56 + 1) {
                auVar102 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar10 +
                                                           uVar56 * 4 + sVar12 * lVar66)),0);
                uVar34 = vpextrw_avx(auVar102,0);
                in_R11 = (ulong)table_gelu_f16[CONCAT44((int)(in_R11 >> 0x20),uVar34)];
                *(float *)((long)pvVar44 + uVar56 * 4 + sVar11 * lVar66) = table_f32_f16[in_R11];
              }
            }
            return;
          }
          pcVar57 = "ggml_are_same_shape(src0, dst)";
          uVar36 = 0x1473;
        }
        else {
          pcVar57 = "ggml_is_contiguous(dst)";
          uVar36 = 0x1472;
        }
      }
      else {
        pcVar57 = "ggml_is_contiguous(src0)";
        uVar36 = 0x1471;
      }
    }
    else {
      if ((GGML_TYPE_F16 < gVar1) && (gVar1 != GGML_TYPE_COUNT)) {
        return;
      }
      pcVar57 = "false";
      uVar36 = 0x14a7;
    }
    goto LAB_00121356;
  case GGML_OP_SILU:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      _Var24 = ggml_is_contiguous(pgVar7);
      if (_Var24) {
        _Var24 = ggml_is_contiguous(tensor);
        if (_Var24) {
          _Var24 = ggml_are_same_shape(pgVar7,tensor);
          if (_Var24) {
            if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
              return;
            }
            iVar52 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
            iVar27 = (params->nth + iVar52 + -1) / params->nth;
            lVar66 = (long)params->ith * (long)iVar27;
            iVar27 = iVar27 + (int)lVar66;
            if (iVar52 <= iVar27) {
              iVar27 = iVar52;
            }
            uVar25 = pgVar7->ne[0];
            if (pgVar7->ne[0] < 1) {
              uVar25 = 0;
            }
            for (; lVar66 < iVar27; lVar66 = lVar66 + 1) {
              sVar11 = tensor->nb[1];
              pvVar44 = tensor->data;
              sVar12 = pgVar7->nb[1];
              pvVar10 = pgVar7->data;
              for (uVar56 = 0; uVar25 != uVar56; uVar56 = uVar56 + 1) {
                auVar102 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar10 +
                                                           uVar56 * 4 + sVar12 * lVar66)),0);
                uVar34 = vpextrw_avx(auVar102,0);
                in_R11 = (ulong)table_silu_f16[CONCAT44((int)(in_R11 >> 0x20),uVar34)];
                *(float *)((long)pvVar44 + uVar56 * 4 + sVar11 * lVar66) = table_f32_f16[in_R11];
              }
            }
            return;
          }
          pcVar57 = "ggml_are_same_shape(src0, dst)";
          uVar36 = 0x14b6;
        }
        else {
          pcVar57 = "ggml_is_contiguous(dst)";
          uVar36 = 0x14b5;
        }
      }
      else {
        pcVar57 = "ggml_is_contiguous(src0)";
        uVar36 = 0x14b4;
      }
    }
    else {
      if ((GGML_TYPE_F16 < gVar1) && (gVar1 != GGML_TYPE_COUNT)) {
        return;
      }
      pcVar57 = "false";
      uVar36 = 0x14ea;
    }
    goto LAB_00121356;
  case GGML_OP_NORM:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      _Var24 = ggml_are_same_shape(pgVar7,tensor);
      if (_Var24) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        if (pgVar7->nb[0] == 4) {
          lVar66 = (long)params->ith;
          lVar61 = (long)params->nth;
          uVar25 = pgVar7->ne[0];
          iVar27 = pgVar7->ne[1];
          sVar11 = pgVar7->nb[1];
          sVar12 = pgVar7->nb[2];
          uVar56 = 0;
          uVar71 = 0;
          if (0 < (int)uVar25) {
            uVar71 = (ulong)uVar25;
          }
          sVar13 = pgVar7->nb[3];
          uVar31 = (ulong)(uint)pgVar7->ne[2];
          if (pgVar7->ne[2] < 1) {
            uVar31 = uVar56;
          }
          sVar14 = tensor->nb[1];
          uVar59 = (ulong)(uint)pgVar7->ne[3];
          if (pgVar7->ne[3] < 1) {
            uVar59 = uVar56;
          }
          local_100 = sVar11 * lVar66;
          local_108 = sVar14 * lVar66;
          sVar15 = tensor->nb[2];
          sVar16 = tensor->nb[3];
          for (; uVar56 != uVar59; uVar56 = uVar56 + 1) {
            lVar73 = local_108;
            lVar65 = local_100;
            for (uVar47 = 0; uVar47 != uVar31; uVar47 = uVar47 + 1) {
              lVar46 = lVar73;
              lVar64 = lVar65;
              for (lVar43 = lVar66; lVar43 < iVar27; lVar43 = lVar43 + lVar61) {
                pvVar44 = pgVar7->data;
                dVar80 = 0.0;
                for (uVar35 = 0; uVar71 != uVar35; uVar35 = uVar35 + 1) {
                  dVar80 = dVar80 + (double)*(float *)((long)pvVar44 + uVar35 * 4 + lVar64);
                }
                pvVar10 = tensor->data;
                auVar102 = ZEXT816(0) << 0x40;
                for (uVar35 = 0; uVar71 != uVar35; uVar35 = uVar35 + 1) {
                  dVar81 = (double)*(float *)((long)pvVar44 + uVar35 * 4 + lVar64) -
                           dVar80 / (double)(int)uVar25;
                  *(float *)((long)pvVar10 + uVar35 * 4 + lVar46) = (float)dVar81;
                  auVar100._8_8_ = 0;
                  auVar100._0_8_ = dVar81;
                  auVar102 = vfmadd231sd_fma(auVar102,auVar100,auVar100);
                }
                dVar80 = auVar102._0_8_ / (double)(int)uVar25 + 9.999999747378752e-06;
                if (dVar80 < 0.0) {
                  dVar80 = sqrt(dVar80);
                }
                else {
                  auVar84._8_8_ = 0;
                  auVar84._0_8_ = dVar80;
                  auVar102 = vsqrtsd_avx(auVar84,auVar84);
                  dVar80 = auVar102._0_8_;
                }
                ggml_vec_scale_f32(uVar25,(float *)(lVar43 * sVar14 + uVar47 * sVar15 +
                                                    uVar56 * sVar16 + (long)pvVar10),
                                   (float)(1.0 / dVar80));
                lVar64 = lVar64 + sVar11 * lVar61;
                lVar46 = lVar46 + sVar14 * lVar61;
              }
              lVar65 = lVar65 + sVar12;
              lVar73 = lVar73 + sVar15;
            }
            local_100 = local_100 + sVar13;
            local_108 = local_108 + sVar16;
          }
          return;
        }
        pcVar57 = "src0->nb[0] == sizeof(float)";
        uVar36 = 0x14fc;
      }
      else {
        pcVar57 = "ggml_are_same_shape(src0, dst)";
        uVar36 = 0x14f6;
      }
    }
    else {
      if ((GGML_TYPE_F16 < gVar1) && (gVar1 != GGML_TYPE_COUNT)) {
        return;
      }
      pcVar57 = "false";
      uVar36 = 0x153f;
    }
    goto LAB_00121356;
  case GGML_OP_RMS_NORM:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      _Var24 = ggml_are_same_shape(pgVar7,tensor);
      if (_Var24) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        if (pgVar7->nb[0] == 4) {
          iVar27 = params->ith;
          iVar52 = params->nth;
          uVar25 = pgVar7->ne[0];
          iVar51 = pgVar7->ne[1];
          sVar11 = pgVar7->nb[1];
          sVar12 = pgVar7->nb[2];
          sVar13 = pgVar7->nb[3];
          uVar56 = 0;
          uVar71 = 0;
          if (0 < (int)uVar25) {
            uVar71 = (ulong)uVar25;
          }
          sVar14 = tensor->nb[1];
          uVar31 = (ulong)(uint)pgVar7->ne[2];
          if (pgVar7->ne[2] < 1) {
            uVar31 = uVar56;
          }
          uVar59 = (ulong)(uint)pgVar7->ne[3];
          if (pgVar7->ne[3] < 1) {
            uVar59 = uVar56;
          }
          local_f8 = sVar11 * (long)iVar27;
          sVar15 = tensor->nb[2];
          sVar16 = tensor->nb[3];
          for (; uVar56 != uVar59; uVar56 = uVar56 + 1) {
            lVar66 = local_f8;
            for (uVar47 = 0; uVar47 != uVar31; uVar47 = uVar47 + 1) {
              lVar73 = lVar66;
              for (lVar61 = (long)iVar27; lVar61 < iVar51; lVar61 = lVar61 + iVar52) {
                dVar80 = 0.0;
                for (uVar35 = 0; uVar71 != uVar35; uVar35 = uVar35 + 1) {
                  fVar79 = *(float *)((long)pgVar7->data + uVar35 * 4 + lVar73);
                  dVar80 = dVar80 + (double)(fVar79 * fVar79);
                }
                pfVar74 = (float *)((long)tensor->data +
                                   uVar47 * sVar15 + uVar56 * sVar16 + lVar61 * sVar14);
                memcpy(pfVar74,(void *)(lVar61 * sVar11 + uVar47 * sVar12 + uVar56 * sVar13 +
                                       (long)pgVar7->data),(long)(int)uVar25 << 2);
                dVar80 = dVar80 / (double)(int)uVar25 + 9.999999747378752e-06;
                if (dVar80 < 0.0) {
                  dVar80 = sqrt(dVar80);
                }
                else {
                  auVar87._8_8_ = 0;
                  auVar87._0_8_ = dVar80;
                  auVar102 = vsqrtsd_avx(auVar87,auVar87);
                  dVar80 = auVar102._0_8_;
                }
                ggml_vec_scale_f32(uVar25,pfVar74,(float)(1.0 / dVar80));
                lVar73 = lVar73 + sVar11 * (long)iVar52;
              }
              lVar66 = lVar66 + sVar12;
            }
            local_f8 = local_f8 + sVar13;
          }
          return;
        }
        pcVar57 = "src0->nb[0] == sizeof(float)";
        uVar36 = 0x154e;
      }
      else {
        pcVar57 = "ggml_are_same_shape(src0, dst)";
        uVar36 = 0x1548;
      }
    }
    else {
      if ((GGML_TYPE_F16 < gVar1) && (gVar1 != GGML_TYPE_COUNT)) {
        return;
      }
      pcVar57 = "false";
      uVar36 = 0x158f;
    }
    goto LAB_00121356;
  case GGML_OP_MUL_MAT:
    pgVar7 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar7->type) {
      return;
    }
    pgVar5 = tensor->src1;
    switch(pgVar7->type) {
    case GGML_TYPE_Q4_0:
      uVar25 = pgVar7->ne[2];
      if (uVar25 == pgVar5->ne[2]) {
        uVar28 = pgVar7->ne[3];
        if (uVar28 == pgVar5->ne[3]) {
          if (tensor->ne[2] == uVar25) {
            if (tensor->ne[3] == uVar28) {
              iVar27 = (int)pgVar7->nb[1];
              iVar52 = (int)pgVar7->nb[0];
              if (iVar27 == 0x14 || iVar52 == 0x14) {
                if ((int)tensor->nb[0] == 4) {
                  iVar51 = (int)tensor->nb[1];
                  if (iVar51 < 4) {
                    pcVar57 = "nb0 <= nb1";
                    uVar36 = 0x180b;
                  }
                  else {
                    uVar4 = (uint)tensor->nb[2];
                    uVar56 = (ulong)uVar4;
                    if ((int)uVar4 < iVar51) {
                      pcVar57 = "nb1 <= nb2";
                      uVar36 = 0x180c;
                    }
                    else {
                      iVar51 = (int)tensor->nb[3];
                      if (iVar51 < (int)uVar4) {
                        pcVar57 = "nb2 <= nb3";
                        uVar36 = 0x180d;
                      }
                      else {
                        iVar29 = pgVar7->ne[1];
                        if (tensor->ne[0] == iVar29) {
                          uVar39 = pgVar5->ne[1];
                          if (tensor->ne[1] == uVar39) {
                            iVar53 = tensor->ne[2] * tensor->ne[3] * tensor->ne[1] * tensor->ne[0];
                            iVar26 = params->ith;
                            iVar50 = params->nth;
                            if (params->type == GGML_TASK_FINALIZE) {
                              if (iVar52 <= iVar27) {
                                return;
                              }
                              pvVar44 = params->wdata;
                              iVar27 = (iVar50 + iVar53 + -1) / iVar50;
                              iVar26 = iVar26 * iVar27;
                              iVar27 = iVar27 + iVar26;
                              if (iVar53 <= iVar27) {
                                iVar27 = iVar53;
                              }
                              lVar66 = (long)iVar26 * 4;
                              ggml_vec_cpy_f32(iVar27 - iVar26,
                                               (float *)((long)tensor->data + lVar66),
                                               (float *)((long)pvVar44 + (long)iVar26 * 4));
                              pfVar74 = (float *)((long)pvVar44 + lVar66 + (long)iVar53 * 4 + 0x40);
                              for (lVar61 = 1; lVar61 < iVar50; lVar61 = lVar61 + 1) {
                                ggml_vec_acc_f32(iVar27 - iVar26,
                                                 (float *)((long)tensor->data + lVar66),pfVar74);
                                pfVar74 = pfVar74 + (long)iVar53 + 0x10;
                              }
                              return;
                            }
                            iVar55 = pgVar5->ne[0];
                            local_158 = (int)pgVar5->nb[1];
                            local_108._0_4_ = (int)pgVar5->nb[2];
                            local_c8 = (int)pgVar5->nb[3];
                            if (params->type != GGML_TASK_INIT) {
                              pvVar44 = params->wdata;
                              local_140._0_4_ = (int)pgVar7->nb[2];
                              local_f0 = (int)pgVar7->nb[3];
                              if (iVar27 < iVar52) {
                                sVar11 = pgVar5->nb[0];
                                iVar50 = (iVar50 + iVar55 + -1) / iVar50;
                                iVar27 = iVar50 * iVar26;
                                iVar50 = iVar50 + iVar27;
                                if (iVar55 <= iVar50) {
                                  iVar50 = iVar55;
                                }
                                uVar71 = (long)iVar29 / 0x20 & 0xffffffff;
                                if ((int)((long)iVar29 / 0x20) < 1) {
                                  uVar71 = 0;
                                }
                                uVar31 = 0;
                                if (0 < (int)uVar39) {
                                  uVar31 = (ulong)uVar39;
                                }
                                uVar59 = 0;
                                if (0 < (int)uVar25) {
                                  uVar59 = (ulong)uVar25;
                                }
                                if ((int)uVar28 < 1) {
                                  uVar28 = 0;
                                }
                                iVar51 = 0;
                                iVar55 = iVar27 * iVar52;
                                auVar88[8] = 0xf8;
                                auVar88._0_8_ = 0xf8f8f8f8f8f8f8f8;
                                auVar88[9] = 0xf8;
                                auVar88[10] = 0xf8;
                                auVar88[0xb] = 0xf8;
                                auVar88[0xc] = 0xf8;
                                auVar88[0xd] = 0xf8;
                                auVar88[0xe] = 0xf8;
                                auVar88[0xf] = 0xf8;
                                for (uVar47 = 0; uVar47 != uVar28; uVar47 = uVar47 + 1) {
                                  iVar40 = 0;
                                  iVar41 = iVar55;
                                  for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                                    lVar66 = (long)pvVar44 +
                                             (long)iVar40 * 4 +
                                             (long)iVar51 * 4 + (long)((iVar53 + 0x10) * iVar26) * 4
                                    ;
                                    for (uVar72 = 0; uVar72 != uVar31; uVar72 = uVar72 + 1) {
                                      iVar63 = iVar41;
                                      for (lVar61 = (long)iVar27; lVar61 < iVar50;
                                          lVar61 = lVar61 + 1) {
                                        pvVar10 = pgVar7->data;
                                        local_168 = (int)sVar11;
                                        uVar34 = *(undefined4 *)
                                                  ((long)pgVar5->data +
                                                  (long)((int)lVar61 * local_168 +
                                                        (int)uVar72 * local_158 +
                                                        (int)uVar35 * (int)local_108 +
                                                        (int)uVar47 * local_c8));
                                        auVar96._4_4_ = uVar34;
                                        auVar96._0_4_ = uVar34;
                                        auVar96._8_4_ = uVar34;
                                        auVar96._12_4_ = uVar34;
                                        pbVar32 = (byte *)((long)pvVar10 + (long)iVar63 + 4);
                                        lVar73 = lVar66;
                                        for (uVar67 = 0; uVar67 != uVar71; uVar67 = uVar67 + 1) {
                                          fVar79 = *(float *)((long)pvVar10 +
                                                             uVar67 * 0x14 +
                                                             (long)((int)lVar61 * iVar52 +
                                                                   (int)uVar35 * (int)local_140 +
                                                                   (int)uVar47 * local_f0));
                                          pbVar77 = pbVar32;
                                          for (uVar75 = 0; uVar75 < 0x20; uVar75 = uVar75 + 2) {
                                            uVar49 = (undefined7)(uVar56 >> 8);
                                            uVar56 = CONCAT71(uVar49,*pbVar77 >> 4);
                                            auVar102 = vpinsrb_avx(ZEXT416((uint)CONCAT71(uVar49,*
                                                  pbVar77) & 0xffffff0f),(int)uVar56,1);
                                            auVar102 = vpaddb_avx(auVar102,auVar88);
                                            auVar102 = vpmovsxbd_avx(auVar102);
                                            auVar102 = vcvtdq2ps_avx(auVar102);
                                            auVar109._0_4_ = fVar79 * auVar102._0_4_;
                                            auVar109._4_4_ = fVar79 * auVar102._4_4_;
                                            auVar109._8_4_ = fVar79 * auVar102._8_4_;
                                            auVar109._12_4_ = fVar79 * auVar102._12_4_;
                                            auVar114._8_8_ = 0;
                                            auVar114._0_8_ = *(ulong *)(lVar73 + uVar75 * 4);
                                            auVar102 = vfmadd231ps_fma(auVar114,auVar96,auVar109);
                                            uVar36 = vmovlps_avx(auVar102);
                                            *(undefined8 *)(lVar73 + uVar75 * 4) = uVar36;
                                            pbVar77 = pbVar77 + 1;
                                          }
                                          lVar73 = lVar73 + 0x80;
                                          pbVar32 = pbVar32 + 0x14;
                                        }
                                        iVar63 = iVar63 + iVar52;
                                      }
                                      lVar66 = lVar66 + (long)iVar29 * 4;
                                    }
                                    iVar40 = iVar40 + iVar29 * uVar39;
                                    iVar41 = iVar41 + (int)local_140;
                                  }
                                  iVar51 = iVar51 + uVar25 * iVar29 * uVar39;
                                  iVar55 = iVar55 + local_f0;
                                }
                                return;
                              }
                              iVar52 = pgVar7->ne[0];
                              iVar53 = uVar25 * iVar29;
                              iVar55 = uVar28 * iVar53;
                              iVar50 = (iVar55 + iVar50 + -1) / iVar50;
                              iVar26 = iVar26 * iVar50;
                              iVar50 = iVar50 + iVar26;
                              if (iVar55 <= iVar50) {
                                iVar50 = iVar55;
                              }
                              uVar56 = (long)iVar52 / 0x20 & 0xffffffff;
                              if ((int)((long)iVar52 / 0x20) < 1) {
                                uVar56 = 0;
                              }
                              uVar28 = uVar39;
                              if ((int)uVar39 < 1) {
                                uVar28 = 0;
                              }
                              auVar91._8_8_ = 0xf000f000f000f;
                              auVar91._0_8_ = 0xf000f000f000f;
                              auVar91._16_8_ = 0xf000f000f000f;
                              auVar91._24_8_ = 0xf000f000f000f;
                              auVar98._8_8_ = 0xf000f000f000f00;
                              auVar98._0_8_ = 0xf000f000f000f00;
                              auVar98._16_8_ = 0xf000f000f000f00;
                              auVar98._24_8_ = 0xf000f000f000f00;
                              auVar105[8] = 0xf8;
                              auVar105._0_8_ = 0xf8f8f8f8f8f8f8f8;
                              auVar105[9] = 0xf8;
                              auVar105[10] = 0xf8;
                              auVar105[0xb] = 0xf8;
                              auVar105[0xc] = 0xf8;
                              auVar105[0xd] = 0xf8;
                              auVar105[0xe] = 0xf8;
                              auVar105[0xf] = 0xf8;
                              auVar105[0x10] = 0xf8;
                              auVar105[0x11] = 0xf8;
                              auVar105[0x12] = 0xf8;
                              auVar105[0x13] = 0xf8;
                              auVar105[0x14] = 0xf8;
                              auVar105[0x15] = 0xf8;
                              auVar105[0x16] = 0xf8;
                              auVar105[0x17] = 0xf8;
                              auVar105[0x18] = 0xf8;
                              auVar105[0x19] = 0xf8;
                              auVar105[0x1a] = 0xf8;
                              auVar105[0x1b] = 0xf8;
                              auVar105[0x1c] = 0xf8;
                              auVar105[0x1d] = 0xf8;
                              auVar105[0x1e] = 0xf8;
                              auVar105[0x1f] = 0xf8;
                              for (; iVar26 < iVar50; iVar26 = iVar26 + 1) {
                                iVar63 = iVar26 / iVar53;
                                uVar71 = (ulong)(uint)((int)((long)iVar26 % (long)iVar53) >> 0x1f)
                                         << 0x20 | (long)iVar26 % (long)iVar53 & 0xffffffffU;
                                iVar40 = (int)((long)uVar71 % (long)iVar29);
                                iVar55 = (int)((long)uVar71 / (long)iVar29);
                                iVar41 = iVar63 * local_f0 + iVar40 * iVar27 +
                                         iVar55 * (int)local_140;
                                pvVar10 = pgVar7->data;
                                pvVar17 = tensor->data;
                                uVar71 = 0;
                                for (uVar31 = 0; uVar31 != uVar28; uVar31 = uVar31 + 1) {
                                  lVar66 = (uVar71 >> 5) +
                                           ((ulong)((long)(int)((iVar63 * uVar25 + iVar55) *
                                                               uVar39 * iVar52) * 0x14) >> 5) + 4;
                                  auVar102 = ZEXT816(0) << 0x40;
                                  for (lVar61 = 0; uVar56 * 0x14 - lVar61 != 0;
                                      lVar61 = lVar61 + 0x14) {
                                    fVar79 = *(float *)((long)pvVar10 + lVar61 + iVar41) *
                                             *(float *)((long)pvVar44 + lVar61 + lVar66 + -4);
                                    auVar116._4_4_ = fVar79;
                                    auVar116._0_4_ = fVar79;
                                    auVar116._8_4_ = fVar79;
                                    auVar116._12_4_ = fVar79;
                                    auVar116._16_4_ = fVar79;
                                    auVar116._20_4_ = fVar79;
                                    auVar116._24_4_ = fVar79;
                                    auVar116._28_4_ = fVar79;
                                    auVar118 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                                               ((long)pvVar10 +
                                                               lVar61 + (long)iVar41 + 4));
                                    auVar90 = vpand_avx2(auVar118,auVar91);
                                    auVar118 = vpsllw_avx2(auVar118,4);
                                    auVar118 = vpand_avx2(auVar118,auVar98);
                                    auVar20 = vpor_avx2(auVar118,auVar90);
                                    auVar118 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                                               ((long)pvVar44 + lVar61 + lVar66));
                                    auVar90 = vpand_avx2(auVar118,auVar91);
                                    auVar118 = vpsllw_avx2(auVar118,4);
                                    auVar118 = vpand_avx2(auVar118,auVar98);
                                    auVar118 = vpor_avx2(auVar118,auVar90);
                                    auVar90 = vpaddb_avx2(auVar20,auVar105);
                                    auVar118 = vpaddb_avx2(auVar118,auVar105);
                                    auVar20 = vpmovsxbw_avx2(auVar90._0_16_);
                                    auVar19 = vpmovsxbw_avx2(auVar118._0_16_);
                                    auVar20 = vpmaddwd_avx2(auVar19,auVar20);
                                    auVar90 = vpmovsxbw_avx2(auVar90._16_16_);
                                    auVar118 = vpmovsxbw_avx2(auVar118._16_16_);
                                    auVar90 = vpmaddwd_avx2(auVar90,auVar118);
                                    auVar90 = vpaddd_avx2(auVar90,auVar20);
                                    auVar90 = vcvtdq2ps_avx(auVar90);
                                    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar116,auVar90);
                                  }
                                  auVar110._0_4_ = auVar102._0_4_ + 0.0;
                                  auVar110._4_4_ = auVar102._4_4_ + 0.0;
                                  auVar110._8_4_ = auVar102._8_4_ + 0.0;
                                  auVar110._12_4_ = auVar102._12_4_ + 0.0;
                                  auVar102 = vshufpd_avx(auVar110,auVar110,1);
                                  auVar111._0_4_ = auVar110._0_4_ + auVar102._0_4_;
                                  auVar111._4_4_ = auVar110._4_4_ + auVar102._4_4_;
                                  auVar111._8_4_ = auVar110._8_4_ + auVar102._8_4_;
                                  auVar111._12_4_ = auVar110._12_4_ + auVar102._12_4_;
                                  auVar102 = vhaddps_avx(auVar111,auVar111);
                                  *(int *)((long)pvVar17 +
                                          uVar31 * (long)iVar29 * 4 +
                                          (long)(int)(iVar63 * iVar51 + iVar40 * 4 + iVar55 * uVar4)
                                          ) = auVar102._0_4_;
                                  uVar71 = uVar71 + (long)iVar52 * 0x14;
                                }
                              }
                              return;
                            }
                            pvVar44 = params->wdata;
                            if (iVar52 <= iVar27) {
                              uVar71 = 0;
                              uVar56 = (ulong)uVar39;
                              if ((int)uVar39 < 1) {
                                uVar56 = uVar71;
                              }
                              uVar31 = (ulong)uVar25;
                              if ((int)uVar25 < 1) {
                                uVar31 = uVar71;
                              }
                              uVar59 = (ulong)uVar28;
                              if ((int)uVar28 < 1) {
                                uVar59 = uVar71;
                              }
                              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                                uVar35 = uVar71;
                                for (uVar72 = 0; uVar67 = uVar35, uVar75 = uVar56, uVar72 != uVar31;
                                    uVar72 = uVar72 + 1) {
                                  while (uVar75 != 0) {
                                    quantize_row_q4_0((float *)((long)pgVar5->data + uVar67),pvVar44
                                                      ,iVar55);
                                    pvVar44 = (void *)((long)pvVar44 +
                                                      ((ulong)((long)iVar55 * 0x14) >> 5));
                                    uVar67 = uVar67 + (long)local_158;
                                    uVar75 = uVar75 - 1;
                                  }
                                  uVar35 = uVar35 + (long)(int)local_108;
                                }
                                uVar71 = uVar71 + (long)local_c8;
                              }
                              return;
                            }
                            goto LAB_0011ebef;
                          }
                          pcVar57 = "ne1 == ne11";
                          uVar36 = 0x1810;
                        }
                        else {
                          pcVar57 = "ne0 == ne01";
                          uVar36 = 0x180f;
                        }
                      }
                    }
                  }
                }
                else {
                  pcVar57 = "nb0 == sizeof(float)";
                  uVar36 = 0x180a;
                }
              }
              else {
                pcVar57 = 
                "nb00 == (int) GGML_TYPE_SIZE[GGML_TYPE_Q4_0] || nb01 == (int) GGML_TYPE_SIZE[GGML_TYPE_Q4_0]"
                ;
                uVar36 = 0x1807;
              }
            }
            else {
              pcVar57 = "ne3 == ne13";
              uVar36 = 0x1804;
            }
          }
          else {
            pcVar57 = "ne2 == ne12";
            uVar36 = 0x1803;
          }
        }
        else {
          pcVar57 = "ne03 == ne13";
          uVar36 = 0x1802;
        }
      }
      else {
        pcVar57 = "ne02 == ne12";
        uVar36 = 0x1801;
      }
      break;
    case GGML_TYPE_Q4_1:
      uVar25 = pgVar7->ne[2];
      uVar56 = (ulong)uVar25;
      if (uVar25 == pgVar5->ne[2]) {
        uVar28 = pgVar7->ne[3];
        if (uVar28 == pgVar5->ne[3]) {
          if (tensor->ne[2] == uVar25) {
            if (tensor->ne[3] == uVar28) {
              iVar27 = (int)pgVar7->nb[1];
              iVar52 = (int)pgVar7->nb[0];
              if (iVar27 == 0x18 || iVar52 == 0x18) {
                if ((int)tensor->nb[0] == 4) {
                  iVar51 = (int)tensor->nb[1];
                  if (iVar51 < 4) {
                    pcVar57 = "nb0 <= nb1";
                    uVar36 = 0x1937;
                  }
                  else {
                    iVar29 = (int)tensor->nb[2];
                    if (iVar29 < iVar51) {
                      pcVar57 = "nb1 <= nb2";
                      uVar36 = 0x1938;
                    }
                    else {
                      iVar51 = (int)tensor->nb[3];
                      if (iVar51 < iVar29) {
                        pcVar57 = "nb2 <= nb3";
                        uVar36 = 0x1939;
                      }
                      else {
                        iVar26 = pgVar7->ne[1];
                        if (tensor->ne[0] == iVar26) {
                          uVar4 = pgVar5->ne[1];
                          if (tensor->ne[1] == uVar4) {
                            iVar55 = tensor->ne[2] * tensor->ne[3] * tensor->ne[1] * tensor->ne[0];
                            iVar50 = params->ith;
                            iVar53 = params->nth;
                            if (params->type == GGML_TASK_FINALIZE) {
                              if (iVar52 <= iVar27) {
                                return;
                              }
                              pvVar44 = params->wdata;
                              iVar27 = (iVar53 + iVar55 + -1) / iVar53;
                              iVar50 = iVar50 * iVar27;
                              iVar27 = iVar27 + iVar50;
                              if (iVar55 <= iVar27) {
                                iVar27 = iVar55;
                              }
                              lVar66 = (long)iVar50 * 4;
                              ggml_vec_cpy_f32(iVar27 - iVar50,
                                               (float *)((long)tensor->data + lVar66),
                                               (float *)((long)pvVar44 + (long)iVar50 * 4));
                              pfVar74 = (float *)((long)pvVar44 + lVar66 + (long)iVar55 * 4 + 0x40);
                              for (lVar61 = 1; lVar61 < iVar53; lVar61 = lVar61 + 1) {
                                ggml_vec_acc_f32(iVar27 - iVar50,
                                                 (float *)((long)tensor->data + lVar66),pfVar74);
                                pfVar74 = pfVar74 + (long)iVar55 + 0x10;
                              }
                              return;
                            }
                            iVar41 = pgVar5->ne[0];
                            local_b0 = pgVar5->nb[3];
                            ib02 = (int)pgVar5->nb[1];
                            local_e8 = (int)pgVar5->nb[2];
                            if (params->type != GGML_TASK_INIT) {
                              pvVar44 = params->wdata;
                              ik2_2 = (int)pgVar7->nb[2];
                              local_d8 = (int)pgVar7->nb[3];
                              if (iVar27 < iVar52) {
                                sVar11 = pgVar5->nb[0];
                                iVar53 = (iVar53 + iVar41 + -1) / iVar53;
                                iVar27 = iVar53 * iVar50;
                                iVar53 = iVar53 + iVar27;
                                if (iVar41 <= iVar53) {
                                  iVar53 = iVar41;
                                }
                                iVar51 = (int)((long)iVar26 / 0x20);
                                uVar71 = 0;
                                if (0 < iVar51) {
                                  uVar71 = (long)iVar26 / 0x20 & 0xffffffff;
                                }
                                uVar31 = 0;
                                if (0 < (int)uVar4) {
                                  uVar31 = (ulong)uVar4;
                                }
                                uVar59 = 0;
                                if (0 < (int)uVar25) {
                                  uVar59 = uVar56;
                                }
                                uVar56 = (ulong)uVar28;
                                if ((int)uVar28 < 1) {
                                  uVar56 = 0;
                                }
                                iVar29 = 0;
                                iVar41 = iVar27 * iVar52;
                                for (uVar47 = 0; uVar47 != uVar56; uVar47 = uVar47 + 1) {
                                  iVar63 = 0;
                                  iVar40 = iVar41;
                                  for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                                    lVar66 = (long)pvVar44 +
                                             (long)iVar63 * 4 +
                                             (long)iVar29 * 4 + (long)((iVar55 + 0x10) * iVar50) * 4
                                    ;
                                    for (uVar72 = 0; uVar72 != uVar31; uVar72 = uVar72 + 1) {
                                      iVar42 = iVar40;
                                      for (lVar61 = (long)iVar27; lVar61 < iVar53;
                                          lVar61 = lVar61 + 1) {
                                        pvVar10 = pgVar7->data;
                                        iVar37 = (int)lVar61 * iVar52 +
                                                 (int)uVar35 * ik2_2 + (int)uVar47 * local_d8;
                                        i1_2 = (int)sVar11;
                                        uVar34 = *(undefined4 *)
                                                  ((long)pgVar5->data +
                                                  (long)((int)lVar61 * i1_2 +
                                                        (int)uVar72 * ib02 +
                                                        (int)uVar35 * local_e8 +
                                                        (int)uVar47 * (int)local_b0));
                                        auVar89._4_4_ = uVar34;
                                        auVar89._0_4_ = uVar34;
                                        auVar89._8_4_ = uVar34;
                                        auVar89._12_4_ = uVar34;
                                        pbVar32 = (byte *)((long)iVar42 + (long)iVar51 * 8 +
                                                          (long)pvVar10);
                                        lVar73 = lVar66;
                                        for (uVar67 = 0; uVar67 != uVar71; uVar67 = uVar67 + 1) {
                                          uVar34 = *(undefined4 *)
                                                    ((long)pvVar10 +
                                                    uVar67 * 4 + (long)iVar51 * 4 + (long)iVar37);
                                          auVar97._4_4_ = uVar34;
                                          auVar97._0_4_ = uVar34;
                                          auVar97._8_4_ = uVar34;
                                          auVar97._12_4_ = uVar34;
                                          uVar34 = *(undefined4 *)
                                                    ((long)pvVar10 + uVar67 * 4 + (long)iVar37);
                                          auVar104._4_4_ = uVar34;
                                          auVar104._0_4_ = uVar34;
                                          auVar104._8_4_ = uVar34;
                                          auVar104._12_4_ = uVar34;
                                          pbVar77 = pbVar32;
                                          for (uVar75 = 0; uVar75 < 0x20; uVar75 = uVar75 + 2) {
                                            uVar49 = (undefined7)((ulong)unaff_RBP >> 8);
                                            unaff_RBP = CONCAT71(uVar49,*pbVar77 >> 4);
                                            auVar102 = vpinsrb_avx(ZEXT416((uint)CONCAT71(uVar49,*
                                                  pbVar77) & 0xffffff0f),(int)unaff_RBP,1);
                                            auVar102 = vpmovzxbd_avx(auVar102);
                                            auVar102 = vcvtdq2ps_avx(auVar102);
                                            auVar102 = vfmadd213ps_fma(auVar102,auVar97,auVar104);
                                            auVar115._8_8_ = 0;
                                            auVar115._0_8_ = *(ulong *)(lVar73 + uVar75 * 4);
                                            auVar102 = vfmadd231ps_fma(auVar115,auVar89,auVar102);
                                            uVar36 = vmovlps_avx(auVar102);
                                            *(undefined8 *)(lVar73 + uVar75 * 4) = uVar36;
                                            pbVar77 = pbVar77 + 1;
                                          }
                                          lVar73 = lVar73 + 0x80;
                                          pbVar32 = pbVar32 + 0x10;
                                        }
                                        iVar42 = iVar42 + iVar52;
                                      }
                                      lVar66 = lVar66 + (long)iVar26 * 4;
                                    }
                                    iVar63 = iVar63 + iVar26 * uVar4;
                                    iVar40 = iVar40 + ik2_2;
                                  }
                                  iVar29 = iVar29 + uVar25 * iVar26 * uVar4;
                                  iVar41 = iVar41 + local_d8;
                                }
                                return;
                              }
                              iVar52 = pgVar7->ne[0];
                              iVar55 = uVar25 * iVar26;
                              iVar41 = uVar28 * iVar55;
                              iVar53 = (iVar41 + iVar53 + -1) / iVar53;
                              iVar50 = iVar50 * iVar53;
                              iVar53 = iVar53 + iVar50;
                              if (iVar41 <= iVar53) {
                                iVar53 = iVar41;
                              }
                              uVar28 = iVar52 / 0x20;
                              lVar66 = (long)(int)uVar28;
                              uVar56 = 0;
                              if (0 < (int)uVar28) {
                                uVar56 = (ulong)uVar28;
                              }
                              uVar28 = uVar4;
                              if ((int)uVar4 < 1) {
                                uVar28 = 0;
                              }
                              for (; iVar50 < iVar53; iVar50 = iVar50 + 1) {
                                iVar42 = iVar50 / iVar55;
                                uVar71 = (ulong)(uint)((int)((long)iVar50 % (long)iVar55) >> 0x1f)
                                         << 0x20 | (long)iVar50 % (long)iVar55 & 0xffffffffU;
                                iVar40 = (int)((long)uVar71 % (long)iVar26);
                                iVar41 = (int)((long)uVar71 / (long)iVar26);
                                iVar63 = iVar42 * local_d8 + iVar40 * iVar27 + iVar41 * ik2_2;
                                pvVar10 = pgVar7->data;
                                uVar31 = (ulong)((long)(int)((iVar42 * uVar25 + iVar41) *
                                                            uVar4 * iVar52) * 0x18) >> 5;
                                pvVar17 = tensor->data;
                                uVar59 = 0;
                                for (uVar71 = 0; uVar71 != uVar28; uVar71 = uVar71 + 1) {
                                  lVar65 = (long)pvVar44 + (uVar59 >> 5) + uVar31 + lVar66 * 8;
                                  lVar61 = ((long)iVar52 * 0x18 * uVar71 >> 5) + uVar31;
                                  auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
                                  lVar73 = (long)pvVar10 + lVar66 * 8 + (long)iVar63;
                                  for (uVar47 = 0; uVar47 != uVar56; uVar47 = uVar47 + 1) {
                                    for (lVar43 = 0; lVar43 != 0x10; lVar43 = lVar43 + 1) {
                                      auVar117._0_4_ = (float)(*(byte *)(lVar73 + lVar43) & 0xf);
                                      auVar117._4_12_ = in_register_00001444;
                                      auVar119._0_4_ = (float)(*(byte *)(lVar73 + lVar43) >> 4);
                                      auVar119._4_12_ = in_register_00001444;
                                      auVar120._0_4_ = (float)(*(byte *)(lVar65 + lVar43) & 0xf);
                                      auVar120._4_12_ = in_register_00001444;
                                      auVar83 = ZEXT416(*(uint *)((long)pvVar10 +
                                                                 uVar47 * 4 + (long)iVar63));
                                      auVar95 = ZEXT416(*(uint *)((long)pvVar10 +
                                                                 uVar47 * 4 +
                                                                 lVar66 * 4 + (long)iVar63));
                                      auVar102 = vfmadd213ss_fma(auVar117,auVar95,auVar83);
                                      auVar83 = vfmadd213ss_fma(auVar119,auVar95,auVar83);
                                      auVar103 = ZEXT416(*(uint *)((long)pvVar44 +
                                                                  uVar47 * 4 + lVar61));
                                      auVar108 = ZEXT416(*(uint *)((long)pvVar44 +
                                                                  uVar47 * 4 + lVar66 * 4 + lVar61))
                                      ;
                                      auVar95 = vfmadd213ss_fma(auVar120,auVar108,auVar103);
                                      auVar121._0_4_ = (float)(*(byte *)(lVar65 + lVar43) >> 4);
                                      auVar121._4_12_ = in_register_00001444;
                                      auVar103 = vfmadd213ss_fma(auVar121,auVar108,auVar103);
                                      auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar103._0_4_ *
                                                                               auVar83._0_4_)),
                                                                 auVar102,auVar95);
                                      auVar93 = ZEXT464((uint)(auVar93._0_4_ + auVar102._0_4_));
                                    }
                                    lVar65 = lVar65 + 0x10;
                                    lVar73 = lVar73 + 0x10;
                                  }
                                  *(int *)((long)pvVar17 +
                                          uVar71 * (long)iVar26 * 4 +
                                          (long)(iVar42 * iVar51 + iVar40 * 4 + iVar41 * iVar29)) =
                                       auVar93._0_4_;
                                  uVar59 = uVar59 + (long)iVar52 * 0x18;
                                }
                              }
                              return;
                            }
                            pvVar44 = params->wdata;
                            if (iVar52 <= iVar27) {
                              if ((int)uVar4 < 1) {
                                uVar4 = 0;
                              }
                              if ((int)uVar25 < 1) {
                                uVar56 = 0;
                              }
                              uVar31 = 0;
                              lVar66 = (long)(int)local_b0;
                              uVar71 = (ulong)uVar28;
                              if ((int)uVar28 < 1) {
                                uVar71 = uVar31;
                              }
                              for (uVar59 = 0; uVar59 != uVar71; uVar59 = uVar59 + 1) {
                                uVar47 = uVar31;
                                for (uVar35 = 0; uVar72 = uVar47, uVar67 = (ulong)uVar4,
                                    uVar35 != uVar56; uVar35 = uVar35 + 1) {
                                  while (uVar67 != 0) {
                                    quantize_row_q4_1((float *)((long)pgVar5->data + uVar72),pvVar44
                                                      ,iVar41);
                                    pvVar44 = (void *)((long)pvVar44 +
                                                      ((ulong)((long)iVar41 * 0x18) >> 5));
                                    uVar72 = uVar72 + (long)ib02;
                                    uVar67 = uVar67 - 1;
                                  }
                                  uVar47 = uVar47 + (long)local_e8;
                                }
                                uVar31 = uVar31 + lVar66;
                              }
                              return;
                            }
                            goto LAB_0011ebef;
                          }
                          pcVar57 = "ne1 == ne11";
                          uVar36 = 0x193c;
                        }
                        else {
                          pcVar57 = "ne0 == ne01";
                          uVar36 = 0x193b;
                        }
                      }
                    }
                  }
                }
                else {
                  pcVar57 = "nb0 == sizeof(float)";
                  uVar36 = 0x1936;
                }
              }
              else {
                pcVar57 = 
                "nb00 == (int) GGML_TYPE_SIZE[GGML_TYPE_Q4_1] || nb01 == (int) GGML_TYPE_SIZE[GGML_TYPE_Q4_1]"
                ;
                uVar36 = 0x1933;
              }
            }
            else {
              pcVar57 = "ne3 == ne13";
              uVar36 = 0x1930;
            }
          }
          else {
            pcVar57 = "ne2 == ne12";
            uVar36 = 0x192f;
          }
        }
        else {
          pcVar57 = "ne03 == ne13";
          uVar36 = 0x192e;
        }
      }
      else {
        pcVar57 = "ne02 == ne12";
        uVar36 = 0x192d;
      }
      break;
    default:
      pcVar57 = "false";
      uVar36 = 0x1a4a;
      break;
    case GGML_TYPE_F16:
      uVar25 = pgVar7->ne[2];
      if (uVar25 == pgVar5->ne[2]) {
        uVar28 = pgVar7->ne[3];
        if (uVar28 == pgVar5->ne[3]) {
          if (tensor->ne[2] == uVar25) {
            if (tensor->ne[3] == uVar28) {
              iVar27 = (int)pgVar7->nb[0];
              if ((pgVar7->nb[1] & 0xffffffff) == 2 || iVar27 == 2) {
                if ((int)tensor->nb[0] == 4) {
                  iVar52 = (int)tensor->nb[1];
                  if (iVar52 < 4) {
                    pcVar57 = "nb0 <= nb1";
                    uVar36 = 0x16d9;
                  }
                  else {
                    iVar51 = (int)tensor->nb[2];
                    if (iVar51 < iVar52) {
                      pcVar57 = "nb1 <= nb2";
                      uVar36 = 0x16da;
                    }
                    else {
                      iVar52 = (int)tensor->nb[3];
                      if (iVar52 < iVar51) {
                        pcVar57 = "nb2 <= nb3";
                        uVar36 = 0x16db;
                      }
                      else {
                        iVar29 = pgVar7->ne[1];
                        uVar56 = (ulong)iVar29;
                        if (tensor->ne[0] == iVar29) {
                          uVar4 = pgVar5->ne[1];
                          if (tensor->ne[1] == uVar4) {
                            iVar53 = tensor->ne[2] * tensor->ne[3] * tensor->ne[1] * tensor->ne[0];
                            iVar26 = params->ith;
                            iVar50 = params->nth;
                            local_178._0_4_ = (int)pgVar7->nb[1];
                            if (params->type == GGML_TASK_FINALIZE) {
                              if (iVar27 <= (int)local_178) {
                                return;
                              }
                              pvVar44 = params->wdata;
                              iVar27 = (iVar50 + iVar53 + -1) / iVar50;
                              iVar26 = iVar26 * iVar27;
                              iVar27 = iVar27 + iVar26;
                              if (iVar53 <= iVar27) {
                                iVar27 = iVar53;
                              }
                              for (lVar66 = (long)iVar26; lVar66 < iVar27; lVar66 = lVar66 + 1) {
                                *(float *)((long)tensor->data + lVar66 * 4) =
                                     table_f32_f16[*(ushort *)((long)pvVar44 + lVar66 * 2)];
                              }
                              lVar61 = (long)pvVar44 + (long)iVar53 * 2 + 0x20;
                              for (lVar66 = 1; lVar73 = (long)iVar26, lVar66 < iVar50;
                                  lVar66 = lVar66 + 1) {
                                for (; lVar73 < iVar27; lVar73 = lVar73 + 1) {
                                  *(float *)((long)tensor->data + lVar73 * 4) =
                                       table_f32_f16[*(ushort *)(lVar61 + lVar73 * 2)] +
                                       *(float *)((long)tensor->data + lVar73 * 4);
                                }
                                lVar61 = lVar61 + (long)iVar53 * 2 + 0x20;
                              }
                              return;
                            }
                            uVar39 = pgVar5->ne[0];
                            iVar55 = (int)pgVar5->nb[0];
                            i1_4 = (int)pgVar5->nb[1];
                            ik2_2 = (int)pgVar5->nb[2];
                            local_f0 = (int)pgVar5->nb[3];
                            if (params->type != GGML_TASK_INIT) {
                              pvVar44 = params->wdata;
                              local_f8._0_4_ = (int)pgVar7->nb[3];
                              local_138 = (int)pgVar7->nb[2];
                              if (iVar27 <= (int)local_178) {
                                iVar27 = pgVar7->ne[0];
                                iVar53 = uVar25 * iVar29;
                                iVar55 = uVar28 * iVar53;
                                iVar50 = (iVar55 + iVar50 + -1) / iVar50;
                                iVar26 = iVar26 * iVar50;
                                iVar50 = iVar50 + iVar26;
                                if (iVar55 <= iVar50) {
                                  iVar50 = iVar55;
                                }
                                uVar28 = 0;
                                if (0 < (int)uVar4) {
                                  uVar28 = uVar4;
                                }
                                for (; iVar26 < iVar50; iVar26 = iVar26 + 1) {
                                  iVar55 = iVar26 / iVar53;
                                  uVar71 = (long)iVar26 % (long)iVar53;
                                  uVar39 = (int)uVar71 >> 0x1f;
                                  iVar41 = (int)((long)((ulong)uVar39 << 0x20 | uVar71 & 0xffffffff)
                                                % (long)iVar29);
                                  iVar40 = (int)((long)((ulong)uVar39 << 0x20 | uVar71 & 0xffffffff)
                                                / (long)iVar29);
                                  pvVar10 = pgVar7->data;
                                  pgVar70 = (ggml_fp16_t *)
                                            ((long)pvVar44 +
                                            (long)(int)((iVar55 * uVar25 + iVar40) * uVar4 * iVar27)
                                            * 2);
                                  pfVar74 = (float *)((long)(iVar55 * iVar52 + iVar41 * 4 +
                                                            iVar40 * iVar51) + (long)tensor->data);
                                  uVar71 = (ulong)uVar28;
                                  while (bVar78 = uVar71 != 0, uVar71 = uVar71 - 1, bVar78) {
                                    ggml_vec_dot_f16(iVar27,pfVar74,
                                                     (ggml_fp16_t *)
                                                     ((long)(iVar55 * (int)local_f8 +
                                                             iVar41 * (int)local_178 +
                                                            iVar40 * local_138) + (long)pvVar10),
                                                     pgVar70);
                                    pgVar70 = pgVar70 + iVar27;
                                    pfVar74 = pfVar74 + uVar56;
                                  }
                                }
                                return;
                              }
                              iVar50 = (int)(iVar50 + uVar39 + -1) / iVar50;
                              iVar52 = iVar50 * iVar26;
                              uVar30 = iVar50 + iVar52;
                              if ((int)uVar39 <= (int)uVar30) {
                                uVar30 = uVar39;
                              }
                              uVar71 = 0;
                              if (0 < (int)uVar4) {
                                uVar71 = (ulong)uVar4;
                              }
                              uVar31 = 0;
                              if (0 < (int)uVar25) {
                                uVar31 = (ulong)uVar25;
                              }
                              iVar51 = 0;
                              if ((int)uVar28 < 1) {
                                uVar28 = 0;
                              }
                              local_108._0_4_ = iVar52 * iVar27;
                              uVar59 = 0;
                              do {
                                if (uVar59 == uVar28) {
                                  return;
                                }
                                iVar41 = 0;
                                iVar50 = (int)local_108;
                                for (uVar47 = 0; uVar47 != uVar31; uVar47 = uVar47 + 1) {
                                  lVar66 = (long)pvVar44 +
                                           (long)iVar41 * 2 +
                                           (long)iVar51 * 2 + (long)((iVar53 + 0x10) * iVar26) * 2;
                                  for (uVar35 = 0; uVar35 != uVar71; uVar35 = uVar35 + 1) {
                                    lVar61 = (long)iVar52;
                                    iVar40 = iVar50;
                                    while (lVar61 < (int)uVar30) {
                                      uVar34 = *(undefined4 *)
                                                ((long)pgVar5->data +
                                                (long)((int)lVar61 * iVar55 +
                                                      (int)uVar35 * i1_4 +
                                                      (int)uVar47 * ik2_2 + (int)uVar59 * local_f0))
                                      ;
                                      auVar90._4_4_ = uVar34;
                                      auVar90._0_4_ = uVar34;
                                      auVar90._8_4_ = uVar34;
                                      auVar90._12_4_ = uVar34;
                                      auVar90._16_4_ = uVar34;
                                      auVar90._20_4_ = uVar34;
                                      auVar90._24_4_ = uVar34;
                                      auVar90._28_4_ = uVar34;
                                      lVar43 = (long)iVar40 + (long)pgVar7->data;
                                      lVar73 = lVar66;
                                      for (lVar65 = 0; lVar65 < (long)(uVar56 & 0xffffffffffffffe0);
                                          lVar65 = lVar65 + 0x20) {
                                        for (lVar46 = 0; lVar46 != 0x40; lVar46 = lVar46 + 0x10) {
                                          auVar91 = vcvtph2ps_f16c(*(undefined1 (*) [16])
                                                                    (lVar43 + lVar46));
                                          auVar98 = vcvtph2ps_f16c(*(undefined1 (*) [16])
                                                                    (lVar73 + lVar46));
                                          auVar102 = vfmadd231ps_fma(auVar98,auVar90,auVar91);
                                          auVar102 = vcvtps2ph_f16c(ZEXT1632(auVar102),0);
                                          *(undefined1 (*) [16])(lVar73 + lVar46) = auVar102;
                                        }
                                        lVar73 = lVar73 + 0x40;
                                        lVar43 = lVar43 + 0x40;
                                      }
                                      lVar61 = lVar61 + 1;
                                      iVar40 = iVar40 + iVar27;
                                      if ((int)(uVar56 & 0xffffffffffffffe0) != iVar29) {
                                        pcVar57 = "false";
                                        uVar36 = 0x6c7;
                                        goto LAB_00121356;
                                      }
                                    }
                                    lVar66 = lVar66 + uVar56 * 2;
                                  }
                                  iVar41 = iVar41 + iVar29 * uVar4;
                                  iVar50 = iVar50 + local_138;
                                }
                                uVar59 = uVar59 + 1;
                                iVar51 = iVar51 + uVar25 * iVar29 * uVar4;
                                local_108._0_4_ = (int)local_108 + (int)local_f8;
                              } while( true );
                            }
                            pvVar44 = params->wdata;
                            if ((int)local_178 < iVar27) goto LAB_0011ebef;
                            uVar71 = 0;
                            uVar56 = (ulong)uVar39;
                            if ((int)uVar39 < 1) {
                              uVar56 = uVar71;
                            }
                            uVar31 = (ulong)uVar4;
                            if ((int)uVar4 < 1) {
                              uVar31 = uVar71;
                            }
                            uVar59 = (ulong)uVar25;
                            if ((int)uVar25 < 1) {
                              uVar59 = uVar71;
                            }
                            uVar47 = (ulong)uVar28;
                            if ((int)uVar28 < 1) {
                              uVar47 = uVar71;
                            }
                            iVar27 = 0;
                            for (uVar35 = 0; uVar35 != uVar47; uVar35 = uVar35 + 1) {
                              uVar72 = uVar71;
                              for (uVar67 = 0; uVar67 != uVar59; uVar67 = uVar67 + 1) {
                                uVar75 = uVar72;
                                for (uVar69 = 0; uVar69 != uVar31; uVar69 = uVar69 + 1) {
                                  uVar68 = uVar75;
                                  for (uVar48 = 0; uVar56 != uVar48; uVar48 = uVar48 + 1) {
                                    auVar102 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pgVar5->data +
                                                                               uVar68)),0);
                                    vpextrw_avx(auVar102,0);
                                    uVar68 = uVar68 + (long)iVar55;
                                  }
                                  iVar27 = iVar27 + (int)uVar48;
                                  uVar75 = uVar75 + (long)i1_4;
                                }
                                uVar72 = uVar72 + (long)ik2_2;
                              }
                              uVar71 = uVar71 + (long)local_f0;
                            }
                            if ((ulong)((long)iVar27 * 2) <= params->wsize) {
                              return;
                            }
                            pcVar57 = "id*sizeof(ggml_fp16_t) <= params->wsize";
                            uVar36 = 0x1745;
                          }
                          else {
                            pcVar57 = "ne1 == ne11";
                            uVar36 = 0x16de;
                          }
                        }
                        else {
                          pcVar57 = "ne0 == ne01";
                          uVar36 = 0x16dd;
                        }
                      }
                    }
                  }
                }
                else {
                  pcVar57 = "nb0 == sizeof(float)";
                  uVar36 = 0x16d8;
                }
              }
              else {
                pcVar57 = "nb00 == sizeof(ggml_fp16_t) || nb01 == sizeof(ggml_fp16_t)";
                uVar36 = 0x16d5;
              }
            }
            else {
              pcVar57 = "ne3 == ne13";
              uVar36 = 0x16d2;
            }
          }
          else {
            pcVar57 = "ne2 == ne12";
            uVar36 = 0x16d1;
          }
        }
        else {
          pcVar57 = "ne03 == ne13";
          uVar36 = 0x16d0;
        }
      }
      else {
        pcVar57 = "ne02 == ne12";
        uVar36 = 0x16cf;
      }
      break;
    case GGML_TYPE_F32:
      iVar27 = tensor->ne[0];
      iVar52 = tensor->ne[1];
      iVar51 = tensor->ne[2];
      iVar53 = iVar52 * iVar27;
      iVar55 = iVar53 * iVar51 * tensor->ne[3];
      sVar11 = pgVar7->nb[0];
      iVar29 = (int)pgVar7->nb[1];
      iVar26 = params->ith;
      iVar50 = params->nth;
      iVar41 = (int)sVar11;
      if (params->type == GGML_TASK_FINALIZE) {
        if (iVar41 <= iVar29) {
          return;
        }
        pvVar44 = params->wdata;
        iVar27 = (iVar55 + iVar50 + -1) / iVar50;
        iVar26 = iVar26 * iVar27;
        iVar27 = iVar27 + iVar26;
        if (iVar55 <= iVar27) {
          iVar27 = iVar55;
        }
        lVar66 = (long)iVar26 * 4;
        ggml_vec_cpy_f32(iVar27 - iVar26,(float *)((long)tensor->data + lVar66),
                         (float *)((long)pvVar44 + (long)iVar26 * 4));
        pfVar74 = (float *)((long)pvVar44 + lVar66 + (long)iVar55 * 4 + 0x40);
        for (lVar61 = 1; lVar61 < iVar50; lVar61 = lVar61 + 1) {
          ggml_vec_acc_f32(iVar27 - iVar26,(float *)((long)tensor->data + lVar66),pfVar74);
          pfVar74 = pfVar74 + (long)iVar55 + 0x10;
        }
        return;
      }
      if (params->type != GGML_TASK_INIT) {
        iVar40 = pgVar7->ne[1];
        uVar25 = pgVar5->ne[1];
        sVar12 = pgVar7->nb[2];
        sVar13 = pgVar7->nb[3];
        sVar14 = pgVar5->nb[1];
        sVar15 = pgVar5->nb[2];
        sVar16 = pgVar5->nb[3];
        if (iVar29 < iVar41) {
          iVar29 = pgVar5->ne[0];
          sVar21 = pgVar5->nb[0];
          iVar50 = (iVar29 + iVar50 + -1) / iVar50;
          iVar63 = iVar50 * iVar26;
          iVar50 = iVar50 + iVar63;
          if (iVar29 <= iVar50) {
            iVar50 = iVar29;
          }
          pvVar44 = params->wdata;
          uVar56 = (ulong)uVar25;
          if ((int)uVar25 < 1) {
            uVar56 = 0;
          }
          uVar71 = (ulong)(uint)pgVar5->ne[2];
          if (pgVar5->ne[2] < 1) {
            uVar71 = 0;
          }
          uVar25 = pgVar5->ne[3];
          if (pgVar5->ne[3] < 1) {
            uVar25 = 0;
          }
          local_108 = (ulong)(uint)((int)sVar21 * iVar63) << 0x20;
          local_f8 = (ulong)(uint)(iVar41 * iVar63) << 0x20;
          for (uVar31 = 0; uVar31 != uVar25; uVar31 = uVar31 + 1) {
            local_178 = local_f8;
            _ib02 = local_108;
            for (uVar59 = 0; uVar59 != uVar71; uVar59 = uVar59 + 1) {
              lVar66 = _ib02;
              for (uVar47 = 0; uVar47 != uVar56; uVar47 = uVar47 + 1) {
                lVar61 = lVar66;
                lVar73 = local_178;
                for (lVar65 = (long)iVar63; lVar65 < iVar50; lVar65 = lVar65 + 1) {
                  ggml_vec_mad_f32(iVar40,(float *)((long)pvVar44 +
                                                   uVar47 * (long)iVar27 * 4 +
                                                   (long)(iVar53 * (int)uVar59) * 4 +
                                                   (long)(iVar52 * iVar51 * iVar27 * (int)uVar31) *
                                                   4 + (long)((iVar55 + 0x10) * iVar26) * 4),
                                   (float *)((lVar73 >> 0x20) + (long)pgVar7->data),
                                   *(float *)((long)pgVar5->data + (lVar61 >> 0x20)));
                  lVar61 = lVar61 + (sVar21 << 0x20);
                  lVar73 = lVar73 + (sVar11 << 0x20);
                }
                lVar66 = lVar66 + (sVar14 << 0x20);
              }
              _ib02 = _ib02 + (sVar15 << 0x20);
              local_178 = local_178 + (sVar12 << 0x20);
            }
            local_108 = local_108 + (sVar16 << 0x20);
            local_f8 = local_f8 + (sVar13 << 0x20);
          }
          return;
        }
        iVar27 = pgVar7->ne[0];
        sVar21 = tensor->nb[0];
        sVar11 = tensor->nb[1];
        sVar22 = tensor->nb[2];
        sVar23 = tensor->nb[3];
        iVar52 = pgVar7->ne[2] * iVar40;
        iVar51 = pgVar7->ne[3] * iVar52;
        iVar50 = (iVar51 + iVar50 + -1) / iVar50;
        iVar26 = iVar26 * iVar50;
        iVar50 = iVar50 + iVar26;
        if (iVar51 <= iVar50) {
          iVar50 = iVar51;
        }
        uVar56 = 0;
        if (0 < (int)uVar25) {
          uVar56 = (ulong)uVar25;
        }
        for (; iVar26 < iVar50; iVar26 = iVar26 + 1) {
          iVar51 = iVar26 / iVar52;
          iVar53 = (iVar26 % iVar52) / iVar40;
          iVar55 = (iVar26 % iVar52) % iVar40;
          iVar41 = iVar51 * (int)sVar23 + iVar55 * (int)sVar21 + iVar53 * (int)sVar22;
          local_f0 = (int)sVar13;
          ik2_2 = (int)sVar12;
          local_128._0_4_ = (int)sVar15;
          local_e8 = (int)sVar16;
          iVar63 = iVar51 * local_e8 + iVar53 * (int)local_128;
          uVar71 = uVar56;
          while (bVar78 = uVar71 != 0, uVar71 = uVar71 - 1, bVar78) {
            ggml_vec_dot_f32(iVar27,(float *)((long)tensor->data + (long)iVar41),
                             (float *)((long)pgVar7->data +
                                      (long)(iVar51 * local_f0 + iVar55 * iVar29 + iVar53 * ik2_2)),
                             (float *)((long)pgVar5->data + (long)iVar63));
            iVar63 = iVar63 + (int)sVar14;
            iVar41 = iVar41 + (int)sVar11;
          }
        }
        return;
      }
      if (iVar41 <= iVar29) {
        return;
      }
      pvVar44 = params->wdata;
LAB_0011ebef:
      memset(pvVar44,0,params->wsize);
      return;
    }
    goto LAB_00121356;
  case GGML_OP_SCALE:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      pgVar5 = tensor->src1;
      _Var24 = ggml_is_contiguous(pgVar7);
      if (_Var24) {
        _Var24 = ggml_is_contiguous(tensor);
        if (_Var24) {
          _Var24 = ggml_are_same_shape(pgVar7,tensor);
          if (_Var24) {
            _Var24 = ggml_is_scalar(pgVar5);
            if (_Var24) {
              if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
                return;
              }
              fVar79 = *pgVar5->data;
              iVar27 = pgVar7->ne[0];
              iVar51 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
              iVar52 = (params->nth + iVar51 + -1) / params->nth;
              lVar66 = (long)params->ith * (long)iVar52;
              iVar52 = iVar52 + (int)lVar66;
              if (iVar51 <= iVar52) {
                iVar52 = iVar51;
              }
              for (; lVar66 < iVar52; lVar66 = lVar66 + 1) {
                ggml_vec_scale_f32(iVar27,(float *)(tensor->nb[1] * lVar66 + (long)tensor->data),
                                   fVar79);
              }
              return;
            }
            pcVar57 = "ggml_is_scalar(src1)";
            uVar36 = 0x1a75;
          }
          else {
            pcVar57 = "ggml_are_same_shape(src0, dst)";
            uVar36 = 0x1a74;
          }
        }
        else {
          pcVar57 = "ggml_is_contiguous(dst)";
          uVar36 = 0x1a73;
        }
      }
      else {
        pcVar57 = "ggml_is_contiguous(src0)";
        uVar36 = 0x1a72;
      }
    }
    else {
      if ((GGML_TYPE_F16 < gVar1) && (gVar1 != GGML_TYPE_COUNT)) {
        return;
      }
      pcVar57 = "false";
      uVar36 = 0x1aa2;
    }
    goto LAB_00121356;
  case GGML_OP_GET_ROWS:
    pgVar7 = tensor->src0;
    if (pgVar7->type < 8) {
      pgVar5 = tensor->src1;
      switch(pgVar7->type) {
      case GGML_TYPE_Q4_0:
        if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
          iVar27 = pgVar7->ne[0];
          uVar25 = pgVar5->ne[1] * pgVar5->ne[0] * pgVar5->ne[2] * pgVar5->ne[3];
          uVar71 = 0;
          uVar56 = (ulong)uVar25;
          if ((int)uVar25 < 1) {
            uVar56 = uVar71;
          }
          for (; uVar56 != uVar71; uVar71 = uVar71 + 1) {
            dequantize_row_q4_0((void *)((long)*(int *)((long)pgVar5->data + uVar71 * 4) *
                                         pgVar7->nb[1] + (long)pgVar7->data),
                                (float *)(tensor->nb[1] * uVar71 + (long)tensor->data),iVar27);
          }
        }
        break;
      case GGML_TYPE_Q4_1:
        if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
          iVar27 = pgVar7->ne[0];
          uVar25 = pgVar5->ne[1] * pgVar5->ne[0] * pgVar5->ne[2] * pgVar5->ne[3];
          uVar71 = 0;
          uVar56 = (ulong)uVar25;
          if ((int)uVar25 < 1) {
            uVar56 = uVar71;
          }
          for (; uVar56 != uVar71; uVar71 = uVar71 + 1) {
            dequantize_row_q4_1((void *)((long)*(int *)((long)pgVar5->data + uVar71 * 4) *
                                         pgVar7->nb[1] + (long)pgVar7->data),
                                (float *)(tensor->nb[1] * uVar71 + (long)tensor->data),iVar27);
          }
        }
        break;
      default:
        pcVar57 = "false";
        uVar36 = 0x1b64;
        goto LAB_00121356;
      case GGML_TYPE_F16:
        if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
          uVar25 = pgVar5->ne[1] * pgVar5->ne[0] * pgVar5->ne[2] * pgVar5->ne[3];
          uVar71 = 0;
          uVar56 = (ulong)(uint)pgVar7->ne[0];
          if (pgVar7->ne[0] < 1) {
            uVar56 = uVar71;
          }
          uVar31 = (ulong)uVar25;
          if ((int)uVar25 < 1) {
            uVar31 = uVar71;
          }
          for (; uVar71 != uVar31; uVar71 = uVar71 + 1) {
            iVar27 = *(int *)((long)pgVar5->data + uVar71 * 4);
            for (uVar59 = 0; uVar56 != uVar59; uVar59 = uVar59 + 1) {
              *(float *)((long)tensor->data + uVar59 * 4 + tensor->nb[1] * uVar71) =
                   table_f32_f16
                   [*(ushort *)((long)pgVar7->data + uVar59 * 2 + pgVar7->nb[1] * (long)iVar27)];
            }
          }
        }
        break;
      case GGML_TYPE_F32:
        if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
          iVar27 = pgVar7->ne[0];
          uVar25 = pgVar5->ne[1] * pgVar5->ne[0] * pgVar5->ne[2] * pgVar5->ne[3];
          uVar71 = 0;
          uVar56 = (ulong)uVar25;
          if ((int)uVar25 < 1) {
            uVar56 = uVar71;
          }
          for (; uVar56 != uVar71; uVar71 = uVar71 + 1) {
            ggml_vec_cpy_f32(iVar27,(float *)(tensor->nb[1] * uVar71 + (long)tensor->data),
                             (float *)((long)*(int *)((long)pgVar5->data + uVar71 * 4) *
                                       pgVar7->nb[1] + (long)pgVar7->data));
          }
        }
      }
    }
    break;
  case GGML_OP_DIAG_MASK_INF:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
        lVar66 = (long)*tensor->src1->data;
        uVar25 = pgVar7->ne[1];
        iVar27 = pgVar7->ne[0];
        uVar56 = (long)(int)(pgVar7->ne[2] * uVar25 * pgVar7->ne[3]) / (long)(int)uVar25;
        uVar31 = 0;
        uVar71 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar71 = uVar31;
        }
        uVar59 = uVar56 & 0xffffffff;
        if ((int)uVar56 < 1) {
          uVar59 = uVar31;
        }
        for (; uVar31 != uVar59; uVar31 = uVar31 + 1) {
          for (uVar56 = 0; uVar56 != uVar71; uVar56 = uVar56 + 1) {
            for (lVar61 = lVar66; lVar61 < iVar27; lVar61 = lVar61 + 1) {
              if ((long)(uVar56 + lVar66) < lVar61) {
                *(undefined4 *)
                 ((long)tensor->data +
                 tensor->nb[0] * lVar61 + tensor->nb[1] * uVar56 + tensor->nb[2] * uVar31) =
                     0xff800000;
              }
            }
          }
        }
      }
    }
    else if ((gVar1 < GGML_TYPE_F32) || (gVar1 == GGML_TYPE_COUNT)) {
      pcVar57 = "false";
      uVar36 = 0x1bb3;
      goto LAB_00121356;
    }
    break;
  case GGML_OP_SOFT_MAX:
    pgVar7 = tensor->src0;
    gVar1 = pgVar7->type;
    if (gVar1 == GGML_TYPE_F32) {
      _Var24 = ggml_is_contiguous(pgVar7);
      if (_Var24) {
        _Var24 = ggml_is_contiguous(tensor);
        if (_Var24) {
          _Var24 = ggml_are_same_shape(pgVar7,tensor);
          if (_Var24) {
            if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
              return;
            }
            uVar56 = 0;
            uVar25 = pgVar7->ne[0];
            iVar52 = pgVar7->ne[2] * pgVar7->ne[1] * pgVar7->ne[3];
            iVar27 = (params->nth + iVar52 + -1) / params->nth;
            lVar66 = (long)params->ith * (long)iVar27;
            iVar27 = iVar27 + (int)lVar66;
            if (iVar52 <= iVar27) {
              iVar27 = iVar52;
            }
            uVar71 = 0;
            if (0 < (int)uVar25) {
              uVar71 = (ulong)uVar25;
            }
            for (; lVar66 < iVar27; lVar66 = lVar66 + 1) {
              pfVar74 = (float *)(tensor->nb[1] * lVar66 + (long)tensor->data);
              local_98[0] = (double)CONCAT44(local_98[0]._4_4_,0xff800000);
              ggml_vec_max_f32(uVar25,(float *)local_98,pfVar74);
              dVar80 = 0.0;
              for (uVar31 = 0; uVar71 != uVar31; uVar31 = uVar31 + 1) {
                fVar79 = 0.0;
                if (-INFINITY < pfVar74[uVar31]) {
                  auVar102 = vcvtps2ph_f16c(ZEXT416((uint)(pfVar74[uVar31] - local_98[0]._0_4_)),0);
                  uVar34 = vpextrw_avx(auVar102,0);
                  uVar56 = (ulong)table_exp_f16[CONCAT44((int)(uVar56 >> 0x20),uVar34)];
                  fVar79 = table_f32_f16[uVar56];
                  dVar80 = dVar80 + (double)fVar79;
                }
                pfVar74[uVar31] = fVar79;
              }
              ggml_vec_scale_f32(uVar25,pfVar74,(float)(1.0 / dVar80));
            }
            return;
          }
          pcVar57 = "ggml_are_same_shape(src0, dst)";
          uVar36 = 0x1bc0;
        }
        else {
          pcVar57 = "ggml_is_contiguous(dst)";
          uVar36 = 0x1bbf;
        }
      }
      else {
        pcVar57 = "ggml_is_contiguous(src0)";
        uVar36 = 0x1bbe;
      }
    }
    else {
      if ((GGML_TYPE_F16 < gVar1) && (gVar1 != GGML_TYPE_COUNT)) {
        return;
      }
      pcVar57 = "false";
      uVar36 = 0x1c11;
    }
    goto LAB_00121356;
  case GGML_OP_ROPE:
    pgVar7 = tensor->src0;
    if (pgVar7->type < 8) {
      switch(pgVar7->type) {
      default:
        pcVar57 = "false";
        uVar36 = 0x1c9e;
        goto LAB_00121356;
      case GGML_TYPE_F16:
        if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
          puVar18 = (uint *)tensor->src1->data;
          uVar25 = puVar18[1];
          uVar28 = puVar18[2];
          iVar27 = pgVar7->ne[2];
          sVar11 = pgVar7->nb[0];
          sVar12 = pgVar7->nb[1];
          lVar66 = (long)(int)pgVar7->nb[2];
          uVar4 = uVar28;
          if (uVar28 != 0) {
            uVar4 = *puVar18;
          }
          uVar56 = (ulong)*puVar18;
          if (uVar28 != 0) {
            uVar56 = 0;
          }
          sVar13 = pgVar7->nb[3];
          uVar71 = (ulong)(uint)pgVar7->ne[1];
          if (pgVar7->ne[1] < 1) {
            uVar71 = 0;
          }
          uVar31 = 0;
          uVar28 = pgVar7->ne[3];
          if (pgVar7->ne[3] < 1) {
            uVar28 = 0;
          }
          _i2_1 = (int)uVar4 * lVar66 + 2;
          for (; uVar31 != uVar28; uVar31 = uVar31 + 1) {
            local_140 = _i2_1;
            for (lVar61 = (long)(int)uVar4; lVar61 < iVar27; lVar61 = lVar61 + 1) {
              lVar73 = local_140;
              for (uVar59 = 0; uVar59 != uVar71; uVar59 = uVar59 + 1) {
                iVar52 = 0;
                lVar65 = lVar73;
                for (lVar43 = 0; lVar43 < (int)uVar25; lVar43 = lVar43 + 2) {
                  dVar80 = pow(10000.0,(double)iVar52 / (double)(int)uVar25);
                  dVar80 = dVar80 * (double)((int)uVar56 + (int)lVar61);
                  dVar81 = cos(dVar80);
                  auVar92._0_8_ = sin(dVar80);
                  auVar92._8_56_ = extraout_var;
                  auVar94._0_8_ =
                       (double)table_f32_f16[*(ushort *)((long)pgVar7->data + lVar65 + -2)];
                  auVar94._8_8_ = in_ZMM5._8_8_;
                  auVar112._8_8_ = 0;
                  auVar112._0_8_ = dVar81;
                  auVar106._8_8_ = 0;
                  auVar106._0_8_ =
                       auVar92._0_8_ *
                       (double)table_f32_f16[*(ushort *)((long)pgVar7->data + lVar65)];
                  auVar102 = vfmsub231sd_fma(auVar106,auVar94,auVar112);
                  auVar107._0_4_ = (float)auVar102._0_8_;
                  auVar107._4_12_ = auVar102._4_12_;
                  auVar102 = vcvtps2ph_f16c(auVar107,0);
                  vpextrw_avx(auVar102,0);
                  auVar99._8_8_ = 0;
                  auVar99._0_8_ =
                       dVar81 * (double)table_f32_f16[*(ushort *)((long)pgVar7->data + lVar65)];
                  auVar102 = vfmadd231sd_fma(auVar99,auVar94,auVar92._0_16_);
                  auVar82._0_4_ = (float)auVar102._0_8_;
                  auVar82._4_12_ = auVar102._4_12_;
                  auVar102 = vcvtps2ph_f16c(auVar82,0);
                  vpextrw_avx(auVar102,0);
                  lVar65 = lVar65 + (long)(int)sVar11 * 2;
                  iVar52 = iVar52 + -2;
                }
                lVar73 = lVar73 + (int)sVar12;
              }
              local_140 = local_140 + lVar66;
            }
            _i2_1 = _i2_1 + (int)sVar13;
          }
        }
        break;
      case GGML_TYPE_F32:
        if ((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) {
          puVar18 = (uint *)tensor->src1->data;
          uVar25 = puVar18[1];
          uVar28 = puVar18[2];
          iVar27 = pgVar7->ne[2];
          sVar11 = pgVar7->nb[0];
          sVar12 = pgVar7->nb[1];
          lVar66 = (long)(int)pgVar7->nb[2];
          sVar13 = pgVar7->nb[3];
          uVar56 = 0;
          uVar4 = uVar28;
          if (uVar28 != 0) {
            uVar4 = *puVar18;
          }
          uVar71 = (ulong)*puVar18;
          if (uVar28 != 0) {
            uVar71 = uVar56;
          }
          uVar31 = (ulong)(uint)pgVar7->ne[1];
          if (pgVar7->ne[1] < 1) {
            uVar31 = uVar56;
          }
          uVar59 = (ulong)(uint)pgVar7->ne[3];
          if (pgVar7->ne[3] < 1) {
            uVar59 = uVar56;
          }
          local_128 = (int)uVar4 * lVar66 + 4;
          for (; lVar61 = local_128, lVar73 = (long)(int)uVar4, uVar56 != uVar59;
              uVar56 = uVar56 + 1) {
            for (; lVar73 < iVar27; lVar73 = lVar73 + 1) {
              lVar65 = lVar61;
              for (uVar47 = 0; uVar47 != uVar31; uVar47 = uVar47 + 1) {
                iVar52 = 0;
                lVar43 = lVar65;
                for (lVar46 = 0; lVar46 < (int)uVar25; lVar46 = lVar46 + 2) {
                  dVar80 = pow(10000.0,(double)iVar52 / (double)(int)uVar25);
                  dVar80 = dVar80 * (double)((int)uVar71 + (int)lVar73);
                  dVar81 = cos(dVar80);
                  auVar93._0_8_ = sin(dVar80);
                  auVar93._8_56_ = extraout_var_00;
                  auVar95._0_8_ = (double)*(float *)((long)pgVar7->data + lVar43 + -4);
                  auVar95._8_8_ = in_ZMM5._8_8_;
                  pvVar44 = tensor->data;
                  dVar80 = (double)*(float *)((long)pgVar7->data + lVar43);
                  auVar113._8_8_ = 0;
                  auVar113._0_8_ = dVar81;
                  auVar108._8_8_ = 0;
                  auVar108._0_8_ = auVar93._0_8_ * dVar80;
                  auVar102 = vfmsub231sd_fma(auVar108,auVar95,auVar113);
                  *(float *)((long)pvVar44 + lVar43 + -4) = (float)auVar102._0_8_;
                  auVar103._8_8_ = 0;
                  auVar103._0_8_ = dVar81 * dVar80;
                  auVar102 = vfmadd231sd_fma(auVar103,auVar95,auVar93._0_16_);
                  *(float *)((long)pvVar44 + lVar43) = (float)auVar102._0_8_;
                  lVar43 = lVar43 + (long)(int)sVar11 * 2;
                  iVar52 = iVar52 + -2;
                }
                lVar65 = lVar65 + (int)sVar12;
              }
              lVar61 = lVar61 + lVar66;
            }
            local_128 = local_128 + (int)sVar13;
          }
        }
      }
    }
    break;
  case GGML_OP_CONV_1D_1S:
    pgVar7 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar7->type) {
      return;
    }
    pgVar5 = tensor->src1;
    switch(pgVar7->type) {
    default:
      pcVar57 = "false";
      uVar36 = 0x1daa;
      break;
    case GGML_TYPE_F16:
      if (pgVar5->type == GGML_TYPE_F32) {
        if (tensor->type == GGML_TYPE_F32) {
          uVar25 = pgVar7->ne[0];
          uVar28 = (int)uVar25 / 2;
          if ((uVar25 & 0x80000001) == 1) {
            if ((int)pgVar7->nb[0] == 2) {
              if ((int)pgVar5->nb[0] == 4) {
                if (params->type == GGML_TASK_FINALIZE) {
                  return;
                }
                uVar39 = pgVar7->ne[1];
                uVar30 = pgVar7->ne[2];
                uVar2 = pgVar5->ne[0];
                uVar56 = (ulong)uVar2;
                uVar4 = uVar39 + 0x1f;
                uVar58 = uVar4 & 0xffffffe0;
                if (params->type == GGML_TASK_INIT) {
                  uVar28 = pgVar5->ne[1];
                  sVar11 = pgVar7->nb[1];
                  sVar12 = pgVar7->nb[2];
                  sVar13 = pgVar5->nb[1];
                  memset(params->wdata,0,params->wsize);
                  pvVar44 = params->wdata;
                  lVar66 = 0;
                  if ((int)uVar39 < 1) {
                    uVar39 = 0;
                  }
                  local_180 = (int)sVar11;
                  local_198 = (int)sVar12;
                  uVar71 = 0;
                  if (0 < (int)uVar30) {
                    uVar71 = (ulong)uVar30;
                  }
                  iVar27 = 0;
                  for (uVar31 = 0; uVar31 != uVar71; uVar31 = uVar31 + 1) {
                    puVar54 = (undefined2 *)((long)pvVar44 + (long)iVar27 * 2);
                    lVar61 = lVar66;
                    for (uVar59 = 0; uVar59 != uVar39; uVar59 = uVar59 + 1) {
                      pvVar10 = pgVar7->data;
                      puVar62 = puVar54;
                      for (uVar47 = 0; uVar25 != uVar47; uVar47 = uVar47 + 1) {
                        *puVar62 = *(undefined2 *)((long)pvVar10 + uVar47 * 2 + lVar61);
                        puVar62 = puVar62 + (int)uVar58;
                      }
                      puVar54 = puVar54 + 1;
                      lVar61 = lVar61 + local_180;
                    }
                    iVar27 = iVar27 + (uVar4 >> 5) * uVar25 * 0x20;
                    lVar66 = lVar66 + local_198;
                  }
                  uVar71 = 0;
                  if ((int)uVar2 < 1) {
                    uVar56 = uVar71;
                  }
                  local_138 = (int)sVar13;
                  uVar31 = (ulong)uVar28;
                  if ((int)uVar28 < 1) {
                    uVar31 = uVar71;
                  }
                  for (uVar59 = 0; uVar59 != uVar31; uVar59 = uVar59 + 1) {
                    for (uVar47 = 0; uVar56 != uVar47; uVar47 = uVar47 + 1) {
                      auVar102 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pgVar5->data +
                                                                 uVar47 * 4 + uVar71)),0);
                      vpextrw_avx(auVar102,0);
                    }
                    uVar71 = uVar71 + (long)local_138;
                  }
                  return;
                }
                sVar11 = tensor->nb[1];
                iVar27 = (int)(uVar30 + params->nth + -1) / params->nth;
                iVar52 = iVar27 * params->ith;
                uVar39 = iVar52 + iVar27;
                if ((int)uVar30 <= (int)uVar39) {
                  uVar39 = uVar30;
                }
                if ((int)uVar2 < 1) {
                  uVar56 = 0;
                }
                lVar73 = ((ulong)uVar28 - (long)(int)uVar28) * (long)(int)uVar58;
                lVar66 = (long)(int)uVar58 * 2;
                iVar27 = params->ith * uVar25 * (uVar4 >> 5) * iVar27 * 0x20;
                for (lVar61 = (long)iVar52; lVar61 < (int)uVar39; lVar61 = lVar61 + 1) {
                  lVar43 = lVar61 * (int)sVar11;
                  pvVar44 = tensor->data;
                  lVar65 = (long)(int)(uVar30 * uVar25 * uVar58) * 2 + lVar73 * 2;
                  for (uVar71 = 0; uVar71 != uVar56; uVar71 = uVar71 + 1) {
                    *(undefined4 *)((long)pvVar44 + uVar71 * 4 + lVar43) = 0;
                    auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
                    lVar46 = lVar73 * 2 + (long)iVar27 * 2;
                    lVar76 = lVar65;
                    for (lVar64 = (long)(int)-uVar28; lVar64 <= (long)(ulong)uVar28;
                        lVar64 = lVar64 + 1) {
                      local_98[0] = (double)((ulong)local_98[0] & 0xffffffff00000000);
                      ggml_vec_dot_f16(uVar58,(float *)local_98,
                                       (ggml_fp16_t *)((long)params->wdata + lVar46),
                                       (ggml_fp16_t *)((long)params->wdata + lVar76));
                      fVar79 = auVar93._0_4_ + local_98[0]._0_4_;
                      auVar93 = ZEXT464((uint)fVar79);
                      *(float *)((long)pvVar44 + uVar71 * 4 + lVar43) = fVar79;
                      lVar76 = lVar76 + lVar66;
                      lVar46 = lVar46 + lVar66;
                    }
                    lVar65 = lVar65 + lVar66;
                  }
                  iVar27 = iVar27 + (uVar4 >> 5) * uVar25 * 0x20;
                }
                return;
              }
              pcVar57 = "nb10 == sizeof(float)";
              uVar36 = 0x1cda;
            }
            else {
              pcVar57 = "nb00 == sizeof(ggml_fp16_t)";
              uVar36 = 0x1cd9;
            }
          }
          else {
            pcVar57 = "ne00 % 2 == 1";
            uVar36 = 0x1cd8;
          }
        }
        else {
          pcVar57 = "dst->type == GGML_TYPE_F32";
          uVar36 = 0x1cac;
        }
      }
      else {
        pcVar57 = "src1->type == GGML_TYPE_F32";
        uVar36 = 0x1cab;
      }
      break;
    case GGML_TYPE_F32:
      if (pgVar5->type == GGML_TYPE_F32) {
        if (tensor->type == GGML_TYPE_F32) {
          uVar25 = pgVar7->ne[0];
          uVar28 = (int)uVar25 / 2;
          if ((uVar25 & 0x80000001) == 1) {
            if ((int)pgVar7->nb[0] == 4) {
              if ((int)pgVar5->nb[0] == 4) {
                if (params->type == GGML_TASK_FINALIZE) {
                  return;
                }
                uVar39 = pgVar7->ne[1];
                uVar30 = pgVar7->ne[2];
                uVar2 = pgVar5->ne[0];
                uVar56 = (ulong)uVar2;
                uVar4 = uVar39 + 0x1f;
                uVar58 = uVar4 & 0xffffffe0;
                if (params->type == GGML_TASK_INIT) {
                  uVar3 = pgVar5->ne[1];
                  sVar11 = pgVar7->nb[1];
                  sVar12 = pgVar7->nb[2];
                  sVar13 = pgVar5->nb[1];
                  uVar31 = 0;
                  memset(params->wdata,0,params->wsize);
                  pvVar44 = params->wdata;
                  lVar66 = (long)(int)uVar58;
                  uVar71 = (ulong)uVar39;
                  if ((int)uVar39 < 1) {
                    uVar71 = uVar31;
                  }
                  local_180 = (int)sVar11;
                  local_188 = (int)sVar12;
                  uVar59 = 0;
                  if (0 < (int)uVar30) {
                    uVar59 = (ulong)uVar30;
                  }
                  iVar27 = 0;
                  for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                    puVar38 = (undefined4 *)((long)pvVar44 + (long)iVar27 * 4);
                    uVar35 = uVar31;
                    for (uVar72 = 0; uVar72 != uVar71; uVar72 = uVar72 + 1) {
                      pvVar10 = pgVar7->data;
                      puVar60 = puVar38;
                      for (uVar67 = 0; uVar25 != uVar67; uVar67 = uVar67 + 1) {
                        *puVar60 = *(undefined4 *)((long)pvVar10 + uVar67 * 4 + uVar35);
                        puVar60 = puVar60 + lVar66;
                      }
                      puVar38 = puVar38 + 1;
                      uVar35 = uVar35 + (long)local_180;
                    }
                    iVar27 = iVar27 + (uVar4 >> 5) * uVar25 * 0x20;
                    uVar31 = uVar31 + (long)local_188;
                  }
                  uVar71 = 0;
                  if ((int)uVar2 < 1) {
                    uVar56 = uVar71;
                  }
                  local_160 = (int)sVar13;
                  uVar31 = (ulong)uVar3;
                  if ((int)uVar3 < 1) {
                    uVar31 = uVar71;
                  }
                  puVar38 = (undefined4 *)
                            ((long)pvVar44 +
                            (long)(int)(uVar58 * uVar25 * uVar30) * 4 + lVar66 * (ulong)uVar28 * 4);
                  for (uVar59 = 0; uVar59 != uVar31; uVar59 = uVar59 + 1) {
                    pvVar44 = pgVar5->data;
                    puVar60 = puVar38;
                    for (uVar47 = 0; uVar56 != uVar47; uVar47 = uVar47 + 1) {
                      *puVar60 = *(undefined4 *)((long)pvVar44 + uVar47 * 4 + uVar71);
                      puVar60 = puVar60 + lVar66;
                    }
                    puVar38 = puVar38 + 1;
                    uVar71 = uVar71 + (long)local_160;
                  }
                  return;
                }
                sVar11 = tensor->nb[1];
                iVar27 = (int)(uVar30 + params->nth + -1) / params->nth;
                iVar52 = iVar27 * params->ith;
                uVar39 = iVar52 + iVar27;
                if ((int)uVar30 <= (int)uVar39) {
                  uVar39 = uVar30;
                }
                if ((int)uVar2 < 1) {
                  uVar56 = 0;
                }
                lVar73 = ((ulong)uVar28 - (long)(int)uVar28) * (long)(int)uVar58;
                lVar61 = (long)(int)uVar58 * 4;
                iVar27 = params->ith * uVar25 * (uVar4 >> 5) * iVar27 * 0x20;
                for (lVar66 = (long)iVar52; lVar66 < (int)uVar39; lVar66 = lVar66 + 1) {
                  lVar43 = lVar66 * (int)sVar11;
                  pvVar44 = tensor->data;
                  lVar65 = (long)(int)(uVar30 * uVar25 * uVar58) * 4 + lVar73 * 4;
                  for (uVar71 = 0; uVar71 != uVar56; uVar71 = uVar71 + 1) {
                    *(undefined4 *)((long)pvVar44 + uVar71 * 4 + lVar43) = 0;
                    auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
                    lVar46 = lVar73 * 4 + (long)iVar27 * 4;
                    lVar76 = lVar65;
                    for (lVar64 = (long)(int)-uVar28; lVar64 <= (long)(ulong)uVar28;
                        lVar64 = lVar64 + 1) {
                      local_98[0] = (double)((ulong)local_98[0] & 0xffffffff00000000);
                      ggml_vec_dot_f32(uVar58,(float *)local_98,
                                       (float *)((long)params->wdata + lVar46),
                                       (float *)((long)params->wdata + lVar76));
                      fVar79 = auVar93._0_4_ + local_98[0]._0_4_;
                      auVar93 = ZEXT464((uint)fVar79);
                      *(float *)((long)pvVar44 + uVar71 * 4 + lVar43) = fVar79;
                      lVar76 = lVar76 + lVar61;
                      lVar46 = lVar46 + lVar61;
                    }
                    lVar65 = lVar65 + lVar61;
                  }
                  iVar27 = iVar27 + (uVar4 >> 5) * uVar25 * 0x20;
                }
                return;
              }
              pcVar57 = "nb10 == sizeof(float)";
              uVar36 = 0x1d52;
            }
            else {
              pcVar57 = "nb00 == sizeof(float)";
              uVar36 = 0x1d51;
            }
          }
          else {
            pcVar57 = "ne00 % 2 == 1";
            uVar36 = 0x1d50;
          }
        }
        else {
          pcVar57 = "dst->type == GGML_TYPE_F32";
          uVar36 = 0x1d24;
        }
      }
      else {
        pcVar57 = "src1->type == GGML_TYPE_F32";
        uVar36 = 0x1d23;
      }
    }
    goto LAB_00121356;
  case GGML_OP_CONV_1D_2S:
    pgVar7 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar7->type) {
      return;
    }
    pgVar5 = tensor->src1;
    switch(pgVar7->type) {
    default:
      pcVar57 = "false";
      uVar36 = 0x1eb6;
      break;
    case GGML_TYPE_F16:
      if (pgVar5->type == GGML_TYPE_F32) {
        if (tensor->type == GGML_TYPE_F32) {
          uVar25 = pgVar7->ne[0];
          uVar28 = (int)uVar25 / 2;
          if ((uVar25 & 0x80000001) == 1) {
            if ((int)pgVar7->nb[0] == 2) {
              if ((int)pgVar5->nb[0] == 4) {
                if (params->type == GGML_TASK_FINALIZE) {
                  return;
                }
                uVar39 = pgVar7->ne[1];
                uVar30 = pgVar7->ne[2];
                uVar2 = pgVar5->ne[0];
                uVar4 = uVar39 + 0x1f;
                uVar58 = uVar4 & 0xffffffe0;
                if (params->type == GGML_TASK_INIT) {
                  uVar28 = pgVar5->ne[1];
                  sVar11 = pgVar7->nb[1];
                  sVar12 = pgVar7->nb[2];
                  sVar13 = pgVar5->nb[1];
                  memset(params->wdata,0,params->wsize);
                  pvVar44 = params->wdata;
                  lVar66 = 0;
                  if ((int)uVar39 < 1) {
                    uVar39 = 0;
                  }
                  local_180 = (int)sVar11;
                  local_198 = (int)sVar12;
                  uVar56 = 0;
                  if (0 < (int)uVar30) {
                    uVar56 = (ulong)uVar30;
                  }
                  iVar27 = 0;
                  for (uVar71 = 0; uVar71 != uVar56; uVar71 = uVar71 + 1) {
                    puVar54 = (undefined2 *)((long)pvVar44 + (long)iVar27 * 2);
                    lVar61 = lVar66;
                    for (uVar31 = 0; uVar31 != uVar39; uVar31 = uVar31 + 1) {
                      pvVar10 = pgVar7->data;
                      puVar62 = puVar54;
                      for (uVar59 = 0; uVar25 != uVar59; uVar59 = uVar59 + 1) {
                        *puVar62 = *(undefined2 *)((long)pvVar10 + uVar59 * 2 + lVar61);
                        puVar62 = puVar62 + (int)uVar58;
                      }
                      puVar54 = puVar54 + 1;
                      lVar61 = lVar61 + local_180;
                    }
                    iVar27 = iVar27 + (uVar4 >> 5) * uVar25 * 0x20;
                    lVar66 = lVar66 + local_198;
                  }
                  uVar71 = 0;
                  uVar56 = (ulong)uVar2;
                  if ((int)uVar2 < 1) {
                    uVar56 = uVar71;
                  }
                  local_138 = (int)sVar13;
                  uVar31 = (ulong)uVar28;
                  if ((int)uVar28 < 1) {
                    uVar31 = uVar71;
                  }
                  for (uVar59 = 0; uVar59 != uVar31; uVar59 = uVar59 + 1) {
                    for (uVar47 = 0; uVar56 != uVar47; uVar47 = uVar47 + 1) {
                      auVar102 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pgVar5->data +
                                                                 uVar47 * 4 + uVar71)),0);
                      vpextrw_avx(auVar102,0);
                    }
                    uVar71 = uVar71 + (long)local_138;
                  }
                  return;
                }
                sVar11 = tensor->nb[1];
                iVar27 = (int)(uVar30 + params->nth + -1) / params->nth;
                iVar52 = iVar27 * params->ith;
                uVar39 = iVar52 + iVar27;
                if ((int)uVar30 <= (int)uVar39) {
                  uVar39 = uVar30;
                }
                lVar73 = (long)(int)uVar58;
                lVar61 = ((ulong)uVar28 - (long)(int)uVar28) * lVar73;
                iVar27 = params->ith * uVar25 * (uVar4 >> 5) * iVar27 * 0x20;
                for (lVar66 = (long)iVar52; lVar66 < (int)uVar39; lVar66 = lVar66 + 1) {
                  lVar43 = lVar66 * (int)sVar11;
                  pvVar44 = tensor->data;
                  lVar65 = (long)(int)(uVar30 * uVar25 * uVar58) * 2 + lVar61 * 2;
                  for (uVar56 = 0; (long)uVar56 < (long)(int)uVar2; uVar56 = uVar56 + 2) {
                    *(undefined4 *)((long)pvVar44 + uVar56 * 2 + lVar43) = 0;
                    auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
                    lVar46 = lVar61 * 2 + (long)iVar27 * 2;
                    lVar76 = lVar65;
                    for (lVar64 = (long)(int)-uVar28; lVar64 <= (long)(ulong)uVar28;
                        lVar64 = lVar64 + 1) {
                      local_98[0] = (double)((ulong)local_98[0] & 0xffffffff00000000);
                      ggml_vec_dot_f16(uVar58,(float *)local_98,
                                       (ggml_fp16_t *)((long)params->wdata + lVar46),
                                       (ggml_fp16_t *)((long)params->wdata + lVar76));
                      fVar79 = auVar93._0_4_ + local_98[0]._0_4_;
                      auVar93 = ZEXT464((uint)fVar79);
                      *(float *)((long)pvVar44 + (uVar56 >> 1) * 4 + lVar43) = fVar79;
                      lVar76 = lVar76 + lVar73 * 2;
                      lVar46 = lVar46 + lVar73 * 2;
                    }
                    lVar65 = lVar65 + lVar73 * 4;
                  }
                  iVar27 = iVar27 + (uVar4 >> 5) * uVar25 * 0x20;
                }
                return;
              }
              pcVar57 = "nb10 == sizeof(float)";
              uVar36 = 0x1de6;
            }
            else {
              pcVar57 = "nb00 == sizeof(ggml_fp16_t)";
              uVar36 = 0x1de5;
            }
          }
          else {
            pcVar57 = "ne00 % 2 == 1";
            uVar36 = 0x1de4;
          }
        }
        else {
          pcVar57 = "dst->type == GGML_TYPE_F32";
          uVar36 = 0x1db8;
        }
      }
      else {
        pcVar57 = "src1->type == GGML_TYPE_F32";
        uVar36 = 0x1db7;
      }
      break;
    case GGML_TYPE_F32:
      if (pgVar5->type == GGML_TYPE_F32) {
        if (tensor->type == GGML_TYPE_F32) {
          uVar25 = pgVar7->ne[0];
          uVar28 = (int)uVar25 / 2;
          if ((uVar25 & 0x80000001) == 1) {
            if ((int)pgVar7->nb[0] == 4) {
              if ((int)pgVar5->nb[0] == 4) {
                if (params->type == GGML_TASK_FINALIZE) {
                  return;
                }
                uVar39 = pgVar7->ne[1];
                uVar30 = pgVar7->ne[2];
                uVar2 = pgVar5->ne[0];
                uVar4 = uVar39 + 0x1f;
                uVar58 = uVar4 & 0xffffffe0;
                if (params->type == GGML_TASK_INIT) {
                  uVar3 = pgVar5->ne[1];
                  sVar11 = pgVar7->nb[1];
                  sVar12 = pgVar7->nb[2];
                  sVar13 = pgVar5->nb[1];
                  uVar71 = 0;
                  memset(params->wdata,0,params->wsize);
                  pvVar44 = params->wdata;
                  lVar66 = (long)(int)uVar58;
                  uVar56 = (ulong)uVar39;
                  if ((int)uVar39 < 1) {
                    uVar56 = uVar71;
                  }
                  local_180 = (int)sVar11;
                  local_188 = (int)sVar12;
                  uVar31 = 0;
                  if (0 < (int)uVar30) {
                    uVar31 = (ulong)uVar30;
                  }
                  iVar27 = 0;
                  for (uVar59 = 0; uVar59 != uVar31; uVar59 = uVar59 + 1) {
                    puVar38 = (undefined4 *)((long)pvVar44 + (long)iVar27 * 4);
                    uVar47 = uVar71;
                    for (uVar35 = 0; uVar35 != uVar56; uVar35 = uVar35 + 1) {
                      pvVar10 = pgVar7->data;
                      puVar60 = puVar38;
                      for (uVar72 = 0; uVar25 != uVar72; uVar72 = uVar72 + 1) {
                        *puVar60 = *(undefined4 *)((long)pvVar10 + uVar72 * 4 + uVar47);
                        puVar60 = puVar60 + lVar66;
                      }
                      puVar38 = puVar38 + 1;
                      uVar47 = uVar47 + (long)local_180;
                    }
                    iVar27 = iVar27 + (uVar4 >> 5) * uVar25 * 0x20;
                    uVar71 = uVar71 + (long)local_188;
                  }
                  uVar71 = 0;
                  uVar56 = (ulong)uVar2;
                  if ((int)uVar2 < 1) {
                    uVar56 = uVar71;
                  }
                  local_160 = (int)sVar13;
                  uVar31 = (ulong)uVar3;
                  if ((int)uVar3 < 1) {
                    uVar31 = uVar71;
                  }
                  puVar38 = (undefined4 *)
                            ((long)pvVar44 +
                            (long)(int)(uVar58 * uVar25 * uVar30) * 4 + lVar66 * (ulong)uVar28 * 4);
                  for (uVar59 = 0; uVar59 != uVar31; uVar59 = uVar59 + 1) {
                    pvVar44 = pgVar5->data;
                    puVar60 = puVar38;
                    for (uVar47 = 0; uVar56 != uVar47; uVar47 = uVar47 + 1) {
                      *puVar60 = *(undefined4 *)((long)pvVar44 + uVar47 * 4 + uVar71);
                      puVar60 = puVar60 + lVar66;
                    }
                    puVar38 = puVar38 + 1;
                    uVar71 = uVar71 + (long)local_160;
                  }
                  return;
                }
                sVar11 = tensor->nb[1];
                iVar27 = (int)(uVar30 + params->nth + -1) / params->nth;
                iVar52 = iVar27 * params->ith;
                uVar39 = iVar52 + iVar27;
                if ((int)uVar30 <= (int)uVar39) {
                  uVar39 = uVar30;
                }
                lVar73 = (long)(int)uVar58;
                lVar61 = ((ulong)uVar28 - (long)(int)uVar28) * lVar73;
                iVar27 = params->ith * uVar25 * (uVar4 >> 5) * iVar27 * 0x20;
                for (lVar66 = (long)iVar52; lVar66 < (int)uVar39; lVar66 = lVar66 + 1) {
                  lVar43 = lVar66 * (int)sVar11;
                  pvVar44 = tensor->data;
                  lVar65 = (long)(int)(uVar30 * uVar25 * uVar58) * 4 + lVar61 * 4;
                  for (uVar56 = 0; (long)uVar56 < (long)(int)uVar2; uVar56 = uVar56 + 2) {
                    *(undefined4 *)((long)pvVar44 + uVar56 * 2 + lVar43) = 0;
                    auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
                    lVar46 = lVar61 * 4 + (long)iVar27 * 4;
                    lVar76 = lVar65;
                    for (lVar64 = (long)(int)-uVar28; lVar64 <= (long)(ulong)uVar28;
                        lVar64 = lVar64 + 1) {
                      local_98[0] = (double)((ulong)local_98[0] & 0xffffffff00000000);
                      ggml_vec_dot_f32(uVar58,(float *)local_98,
                                       (float *)((long)params->wdata + lVar46),
                                       (float *)((long)params->wdata + lVar76));
                      fVar79 = auVar93._0_4_ + local_98[0]._0_4_;
                      auVar93 = ZEXT464((uint)fVar79);
                      *(float *)((long)pvVar44 + (uVar56 >> 1) * 4 + lVar43) = fVar79;
                      lVar76 = lVar76 + lVar73 * 4;
                      lVar46 = lVar46 + lVar73 * 4;
                    }
                    lVar65 = lVar65 + lVar73 * 8;
                  }
                  iVar27 = iVar27 + (uVar4 >> 5) * uVar25 * 0x20;
                }
                return;
              }
              pcVar57 = "nb10 == sizeof(float)";
              uVar36 = 0x1e5e;
            }
            else {
              pcVar57 = "nb00 == sizeof(float)";
              uVar36 = 0x1e5d;
            }
          }
          else {
            pcVar57 = "ne00 % 2 == 1";
            uVar36 = 0x1e5c;
          }
        }
        else {
          pcVar57 = "dst->type == GGML_TYPE_F32";
          uVar36 = 0x1e30;
        }
      }
      else {
        pcVar57 = "src1->type == GGML_TYPE_F32";
        uVar36 = 0x1e2f;
      }
    }
    goto LAB_00121356;
  case GGML_OP_FLASH_ATTN:
    uVar25 = ggml_get_i32_1d(tensor->opt[1],0);
    if (uVar25 < 2) {
      pgVar7 = tensor->src0;
      if (GGML_TYPE_COUNT < pgVar7->type) {
        return;
      }
      pgVar5 = tensor->src1;
      pgVar6 = tensor->opt[0];
      switch(pgVar7->type) {
      default:
        pcVar57 = "false";
        uVar36 = 0x209b;
        break;
      case GGML_TYPE_F16:
        uVar28 = pgVar7->ne[0];
        if (tensor->ne[0] == uVar28) {
          iVar27 = pgVar7->ne[1];
          if (tensor->ne[1] == iVar27) {
            uVar4 = pgVar5->ne[1];
            uVar56 = (ulong)(int)uVar4;
            local_48 = (ulong)(uVar4 - iVar27);
            if ((int)(uVar4 - iVar27) < 0) {
              pcVar57 = "P >= 0";
              uVar36 = 0x1fcc;
            }
            else if ((int)pgVar7->nb[0] == 2) {
              if ((int)pgVar5->nb[0] == 2) {
                if ((int)pgVar6->nb[0] == 2) {
                  if (pgVar5->ne[0] == uVar28) {
                    if (pgVar6->ne[1] == uVar28) {
                      if ((int)tensor->nb[0] == 4) {
                        iVar52 = (int)tensor->nb[1];
                        if (iVar52 < 4) {
                          pcVar57 = "nb0 <= nb1";
                          uVar36 = 0x1fdc;
                        }
                        else {
                          iVar51 = (int)tensor->nb[2];
                          if (iVar51 < iVar52) {
                            pcVar57 = "nb1 <= nb2";
                            uVar36 = 0x1fdd;
                          }
                          else {
                            iVar29 = (int)tensor->nb[3];
                            if (iVar51 <= iVar29) {
                              if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
                                return;
                              }
                              sVar11 = pgVar5->nb[1];
                              sVar13 = pgVar5->nb[2];
                              _local_b8 = CONCAT44(uStack_b4,(int)pgVar5->nb[3]);
                              _i3_1 = CONCAT44(uStack_a4,(int)pgVar7->nb[1]);
                              local_b0 = CONCAT44(local_b0._4_4_,(int)pgVar7->nb[2]);
                              _local_a0 = CONCAT44(uStack_9c,(int)pgVar7->nb[3]);
                              sVar12 = pgVar6->nb[1];
                              local_50 = CONCAT44(local_50._4_4_,(int)pgVar6->nb[2]);
                              local_58 = CONCAT44(local_58._4_4_,(int)pgVar6->nb[3]);
                              uVar39 = uVar4 + 3 & 0xfffffffc;
                              iVar53 = pgVar7->ne[2] * iVar27;
                              local_60 = CONCAT44(local_60._4_4_,iVar53);
                              iVar53 = pgVar7->ne[3] * iVar53;
                              iVar26 = params->ith;
                              iVar50 = (iVar53 + params->nth + -1) / params->nth;
                              iVar55 = iVar50 * iVar26;
                              iVar50 = iVar50 + iVar55;
                              if (iVar53 <= iVar50) {
                                iVar50 = iVar53;
                              }
                              auVar83._0_8_ = (double)(int)uVar28;
                              auVar83._8_8_ = in_XMM0_Qa;
                              if (auVar83._0_8_ < 0.0) {
                                dVar80 = sqrt(auVar83._0_8_);
                              }
                              else {
                                auVar102 = vsqrtsd_avx(auVar83,auVar83);
                                dVar80 = auVar102._0_8_;
                              }
                              local_70 = CONCAT44(local_70._4_4_,(float)(1.0 / dVar80));
                              lVar66 = ((long)(int)(uVar39 * 2) + 0x10) * (long)iVar26;
                              lVar61 = (long)(int)uVar39;
                              local_40 = 0;
                              uVar71 = 0;
                              if (0 < (int)uVar4) {
                                uVar71 = (ulong)uVar4;
                              }
                              if (0 < (int)uVar28) {
                                local_40 = (ulong)uVar28;
                              }
                              iVar53 = (int)sVar11;
                              local_38 = (local_48 & 0xffffffff) * 4 + lVar66 * 4;
                              local_68 = lVar61 * 4 + lVar66 * 4;
                              iVar26 = (int)sVar12;
                              for (; iVar55 < iVar50; iVar55 = iVar55 + 1) {
                                iVar41 = iVar55 / (int)local_60;
                                pvVar44 = params->wdata;
                                pfVar74 = (float *)((long)pvVar44 + lVar66 * 4);
                                for (uVar31 = uVar56; (long)uVar31 < lVar61; uVar31 = uVar31 + 1) {
                                  pfVar74[uVar31] = -INFINITY;
                                }
                                uVar31 = (ulong)(uint)((int)((long)iVar55 % (long)(int)local_60) >>
                                                      0x1f) << 0x20 |
                                         (long)iVar55 % (long)(int)local_60 & 0xffffffffU;
                                iVar40 = (int)((long)uVar31 / (long)iVar27);
                                iVar42 = iVar40 * (int)sVar13;
                                iVar63 = (int)((long)uVar31 % (long)iVar27);
                                lVar73 = (long)(iVar41 * (int)local_a0 + iVar63 * i3_1 +
                                               iVar40 * (int)local_b0);
                                if ((uVar56 & 1) == 0) {
                                  iVar42 = iVar42 + iVar41 * local_b8;
                                  pfVar45 = pfVar74;
                                  for (lVar65 = 0; lVar65 < (long)uVar56; lVar65 = lVar65 + 2) {
                                    ggml_vec_dot_f16_unroll
                                              (uVar28,iVar53,pfVar45,
                                               (void *)((long)pgVar5->data + (long)iVar42),
                                               (ggml_fp16_t *)((long)pgVar7->data + lVar73));
                                    iVar42 = iVar42 + iVar53 * 2;
                                    pfVar45 = pfVar45 + 2;
                                  }
                                }
                                else {
                                  iVar42 = iVar42 + iVar41 * local_b8;
                                  uVar31 = uVar71;
                                  pfVar45 = pfVar74;
                                  while (bVar78 = uVar31 != 0, uVar31 = uVar31 - 1, bVar78) {
                                    ggml_vec_dot_f16(uVar28,pfVar45,
                                                     (ggml_fp16_t *)
                                                     ((long)pgVar5->data + (long)iVar42),
                                                     (ggml_fp16_t *)((long)pgVar7->data + lVar73));
                                    iVar42 = iVar42 + iVar53;
                                    pfVar45 = pfVar45 + 1;
                                  }
                                }
                                ggml_vec_scale_f32(uVar4,pfVar74,(float)local_70);
                                if (uVar25 != 0) {
                                  puVar38 = (undefined4 *)((long)pvVar44 + local_38);
                                  uVar31 = local_48;
                                  while (iVar42 = (int)uVar31, iVar42 < (int)uVar4) {
                                    if (iVar63 + (int)local_48 < iVar42) {
                                      *puVar38 = 0xff800000;
                                    }
                                    puVar38 = puVar38 + 1;
                                    uVar31 = (ulong)(iVar42 + 1);
                                  }
                                }
                                max = -INFINITY;
                                pfVar45 = &max;
                                ggml_vec_max_f32(uVar4,pfVar45,pfVar74);
                                local_98[0] = 0.0;
                                local_98[1] = 0.0;
                                local_98[2] = 0.0;
                                local_98[3] = 0.0;
                                pfVar33 = pfVar74;
                                for (lVar73 = 0; lVar73 < lVar61; lVar73 = lVar73 + 4) {
                                  for (lVar65 = 0; lVar65 != 4; lVar65 = lVar65 + 1) {
                                    fVar79 = 0.0;
                                    if (-INFINITY < pfVar33[lVar65]) {
                                      auVar102 = vcvtps2ph_f16c(ZEXT416((uint)(pfVar33[lVar65] - max
                                                                              )),0);
                                      uVar34 = vpextrw_avx(auVar102,0);
                                      pfVar45 = (float *)(ulong)table_exp_f16
                                                                [CONCAT44((int)((ulong)pfVar45 >>
                                                                               0x20),uVar34)];
                                      fVar79 = table_f32_f16[(long)pfVar45];
                                      local_98[lVar65] = (double)fVar79 + local_98[lVar65];
                                    }
                                    pfVar33[lVar65] = fVar79;
                                  }
                                  pfVar33 = pfVar33 + 4;
                                }
                                fVar79 = 0.0;
                                for (lVar73 = 0; lVar73 != 4; lVar73 = lVar73 + 1) {
                                  fVar79 = (float)((double)fVar79 + local_98[lVar73]);
                                }
                                ggml_vec_scale_f32(uVar4,pfVar74,1.0 / fVar79);
                                pgVar70 = (ggml_fp16_t *)
                                          ((long)params->wdata + lVar61 * 4 + lVar66 * 4);
                                for (uVar31 = 0; uVar71 != uVar31; uVar31 = uVar31 + 1) {
                                  auVar102 = vcvtps2ph_f16c(ZEXT416((uint)pfVar74[uVar31]),0);
                                  vpextrw_avx(auVar102,0);
                                }
                                iVar63 = iVar41 * iVar29 + iVar40 * iVar51 + iVar63 * iVar52;
                                iVar41 = iVar40 * (int)local_50 + iVar41 * (int)local_58;
                                uVar31 = local_40;
                                if (((long)(int)uVar28 & 1U) == 0) {
                                  for (lVar73 = 0; lVar73 < (int)uVar28; lVar73 = lVar73 + 2) {
                                    ggml_vec_dot_f16_unroll
                                              (uVar4,iVar26,
                                               (float *)((long)tensor->data + (long)iVar63),
                                               (void *)((long)pgVar6->data + (long)iVar41),pgVar70);
                                    iVar41 = iVar41 + iVar26 * 2;
                                    iVar63 = iVar63 + 8;
                                  }
                                }
                                else {
                                  while (uVar31 != 0) {
                                    ggml_vec_dot_f16(uVar4,(float *)((long)tensor->data +
                                                                    (long)iVar63),
                                                     (ggml_fp16_t *)
                                                     ((long)pgVar6->data + (long)iVar41),pgVar70);
                                    iVar41 = iVar41 + iVar26;
                                    iVar63 = iVar63 + 4;
                                    uVar31 = uVar31 - 1;
                                  }
                                }
                              }
                              return;
                            }
                            pcVar57 = "nb2 <= nb3";
                            uVar36 = 0x1fde;
                          }
                        }
                      }
                      else {
                        pcVar57 = "nb0 == sizeof(float)";
                        uVar36 = 0x1fdb;
                      }
                    }
                    else {
                      pcVar57 = "nev1 == D";
                      uVar36 = 0x1fd4;
                    }
                  }
                  else {
                    pcVar57 = "nek0 == D";
                    uVar36 = 0x1fd3;
                  }
                }
                else {
                  pcVar57 = "nbv0 == sizeof(ggml_fp16_t)";
                  uVar36 = 0x1fd0;
                }
              }
              else {
                pcVar57 = "nbk0 == sizeof(ggml_fp16_t)";
                uVar36 = 0x1fcf;
              }
            }
            else {
              pcVar57 = "nbq0 == sizeof(ggml_fp16_t)";
              uVar36 = 0x1fce;
            }
          }
          else {
            pcVar57 = "ne1 == N";
            uVar36 = 0x1fcb;
          }
        }
        else {
          pcVar57 = "ne0 == D";
          uVar36 = 0x1fca;
        }
        break;
      case GGML_TYPE_F32:
        uVar28 = pgVar7->ne[0];
        if (tensor->ne[0] == uVar28) {
          iVar27 = pgVar7->ne[1];
          if (tensor->ne[1] == iVar27) {
            uVar4 = pgVar5->ne[1];
            local_70 = (ulong)(uVar4 - iVar27);
            if ((int)(uVar4 - iVar27) < 0) {
              pcVar57 = "P >= 0";
              uVar36 = 0x1efb;
            }
            else if ((int)pgVar7->nb[0] == 4) {
              if ((int)pgVar5->nb[0] == 4) {
                if ((int)pgVar6->nb[0] == 4) {
                  if (pgVar5->ne[0] == uVar28) {
                    if (pgVar6->ne[1] == uVar28) {
                      if ((int)tensor->nb[0] == 4) {
                        iVar52 = (int)tensor->nb[1];
                        if (iVar52 < 4) {
                          pcVar57 = "nb0 <= nb1";
                          uVar36 = 0x1f0b;
                        }
                        else {
                          iVar51 = (int)tensor->nb[2];
                          if (iVar51 < iVar52) {
                            pcVar57 = "nb1 <= nb2";
                            uVar36 = 0x1f0c;
                          }
                          else {
                            iVar29 = (int)tensor->nb[3];
                            if (iVar51 <= iVar29) {
                              if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
                                return;
                              }
                              sVar11 = pgVar5->nb[1];
                              sVar13 = pgVar5->nb[2];
                              sVar14 = pgVar5->nb[3];
                              sVar15 = pgVar7->nb[1];
                              sVar16 = pgVar7->nb[2];
                              sVar21 = pgVar7->nb[3];
                              sVar12 = pgVar6->nb[1];
                              _local_b8 = CONCAT44(uStack_b4,(int)pgVar6->nb[2]);
                              _i3_1 = CONCAT44(uStack_a4,(int)pgVar6->nb[3]);
                              iVar53 = pgVar7->ne[2] * iVar27;
                              local_b0 = CONCAT44(local_b0._4_4_,iVar53);
                              iVar53 = pgVar7->ne[3] * iVar53;
                              iVar26 = params->ith;
                              iVar50 = (iVar53 + params->nth + -1) / params->nth;
                              iVar55 = iVar50 * iVar26;
                              iVar50 = iVar50 + iVar55;
                              if (iVar53 <= iVar50) {
                                iVar50 = iVar53;
                              }
                              auVar102._0_8_ = (double)(int)uVar28;
                              auVar102._8_8_ = in_XMM0_Qa;
                              if (auVar102._0_8_ < 0.0) {
                                dVar80 = sqrt(auVar102._0_8_);
                              }
                              else {
                                auVar102 = vsqrtsd_avx(auVar102,auVar102);
                                dVar80 = auVar102._0_8_;
                              }
                              _local_a0 = CONCAT44(uStack_9c,(float)(1.0 / dVar80));
                              lVar66 = (long)(int)(uVar4 + 3 & 0xfffffffc);
                              local_50 = (lVar66 + 0x10) * (long)iVar26;
                              local_58 = 0;
                              local_60 = 0;
                              if (0 < (int)uVar4) {
                                local_60 = (ulong)uVar4;
                              }
                              if (0 < (int)uVar28) {
                                local_58 = (ulong)uVar28;
                              }
                              local_68 = (local_70 & 0xffffffff) * 4 + local_50 * 4;
                              for (; iVar55 < iVar50; iVar55 = iVar55 + 1) {
                                iVar26 = iVar55 / (int)local_b0;
                                pvVar44 = params->wdata;
                                pfVar74 = (float *)((long)pvVar44 + local_50 * 4);
                                for (lVar61 = (long)(int)uVar4; lVar61 < lVar66; lVar61 = lVar61 + 1
                                    ) {
                                  pfVar74[lVar61] = -INFINITY;
                                }
                                uVar56 = (ulong)(uint)((int)((long)iVar55 % (long)(int)local_b0) >>
                                                      0x1f) << 0x20 |
                                         (long)iVar55 % (long)(int)local_b0 & 0xffffffffU;
                                iVar53 = (int)((long)uVar56 / (long)iVar27);
                                iVar40 = iVar26 * (int)sVar14 + iVar53 * (int)sVar13;
                                iVar41 = (int)((long)uVar56 % (long)iVar27);
                                pfVar45 = pfVar74;
                                uVar56 = local_60;
                                while (bVar78 = uVar56 != 0, uVar56 = uVar56 - 1, bVar78) {
                                  ggml_vec_dot_f32(uVar28,pfVar45,
                                                   (float *)((long)pgVar5->data + (long)iVar40),
                                                   (float *)((long)pgVar7->data +
                                                            (long)(iVar26 * (int)sVar21 +
                                                                   iVar41 * (int)sVar15 +
                                                                  iVar53 * (int)sVar16)));
                                  local_160 = (int)sVar11;
                                  iVar40 = iVar40 + local_160;
                                  pfVar45 = pfVar45 + 1;
                                }
                                ggml_vec_scale_f32(uVar4,pfVar74,local_a0);
                                if (uVar25 != 0) {
                                  puVar38 = (undefined4 *)((long)pvVar44 + local_68);
                                  uVar56 = local_70;
                                  while (iVar40 = (int)uVar56, iVar40 < (int)uVar4) {
                                    if (iVar41 + (int)local_70 < iVar40) {
                                      *puVar38 = 0xff800000;
                                    }
                                    puVar38 = puVar38 + 1;
                                    uVar56 = (ulong)(iVar40 + 1);
                                  }
                                }
                                max = -INFINITY;
                                pfVar45 = &max;
                                ggml_vec_max_f32(uVar4,pfVar45,pfVar74);
                                local_98[0] = 0.0;
                                local_98[1] = 0.0;
                                local_98[2] = 0.0;
                                local_98[3] = 0.0;
                                pfVar33 = pfVar74;
                                for (lVar61 = 0; lVar61 < lVar66; lVar61 = lVar61 + 4) {
                                  for (lVar73 = 0; lVar73 != 4; lVar73 = lVar73 + 1) {
                                    fVar79 = 0.0;
                                    if (-INFINITY < pfVar33[lVar73]) {
                                      auVar102 = vcvtps2ph_f16c(ZEXT416((uint)(pfVar33[lVar73] - max
                                                                              )),0);
                                      uVar34 = vpextrw_avx(auVar102,0);
                                      pfVar45 = (float *)(ulong)table_exp_f16
                                                                [CONCAT44((int)((ulong)pfVar45 >>
                                                                               0x20),uVar34)];
                                      fVar79 = table_f32_f16[(long)pfVar45];
                                      local_98[lVar73] = (double)fVar79 + local_98[lVar73];
                                    }
                                    pfVar33[lVar73] = fVar79;
                                  }
                                  pfVar33 = pfVar33 + 4;
                                }
                                fVar79 = 0.0;
                                for (lVar61 = 0; lVar61 != 4; lVar61 = lVar61 + 1) {
                                  fVar79 = (float)((double)fVar79 + local_98[lVar61]);
                                }
                                ggml_vec_scale_f32(uVar4,pfVar74,1.0 / fVar79);
                                iVar41 = iVar26 * iVar29 + iVar53 * iVar51 + iVar41 * iVar52;
                                iVar26 = iVar26 * i3_1 + iVar53 * local_b8;
                                uVar56 = local_58;
                                while (bVar78 = uVar56 != 0, uVar56 = uVar56 - 1, bVar78) {
                                  ggml_vec_dot_f32(uVar4,(float *)((long)tensor->data + (long)iVar41
                                                                  ),
                                                   (float *)((long)pgVar6->data + (long)iVar26),
                                                   pfVar74);
                                  local_138 = (int)sVar12;
                                  iVar26 = iVar26 + local_138;
                                  iVar41 = iVar41 + 4;
                                }
                              }
                              return;
                            }
                            pcVar57 = "nb2 <= nb3";
                            uVar36 = 0x1f0d;
                          }
                        }
                      }
                      else {
                        pcVar57 = "nb0 == sizeof(float)";
                        uVar36 = 0x1f0a;
                      }
                    }
                    else {
                      pcVar57 = "nev1 == D";
                      uVar36 = 0x1f03;
                    }
                  }
                  else {
                    pcVar57 = "nek0 == D";
                    uVar36 = 0x1f02;
                  }
                }
                else {
                  pcVar57 = "nbv0 == sizeof(float)";
                  uVar36 = 0x1eff;
                }
              }
              else {
                pcVar57 = "nbk0 == sizeof(float)";
                uVar36 = 0x1efe;
              }
            }
            else {
              pcVar57 = "nbq0 == sizeof(float)";
              uVar36 = 0x1efd;
            }
          }
          else {
            pcVar57 = "ne1 == N";
            uVar36 = 0x1efa;
          }
        }
        else {
          pcVar57 = "ne0 == D";
          uVar36 = 0x1ef9;
        }
      }
    }
    else {
      pcVar57 = "t == 0 || t == 1";
      uVar36 = 0x21fc;
    }
    goto LAB_00121356;
  case GGML_OP_FLASH_FF:
    pgVar7 = tensor->src1;
    switch(pgVar7->type) {
    case GGML_TYPE_Q4_0:
    case GGML_TYPE_Q4_1:
    case GGML_TYPE_I8:
    case GGML_TYPE_I16:
    case GGML_TYPE_I32:
    case GGML_TYPE_COUNT:
      pcVar57 = "false";
      uVar36 = 0x216e;
      break;
    case GGML_TYPE_F16:
      pgVar5 = tensor->src0;
      uVar25 = pgVar5->ne[0];
      if (tensor->ne[0] == uVar25) {
        iVar27 = pgVar5->ne[1];
        if (tensor->ne[1] == iVar27) {
          if (tensor->ne[2] == pgVar5->ne[2]) {
            if ((int)pgVar5->nb[0] == 2) {
              if ((int)pgVar7->nb[0] == 2) {
                pgVar6 = tensor->opt[0];
                if ((int)pgVar6->nb[0] == 4) {
                  pgVar8 = tensor->opt[1];
                  if ((int)pgVar8->nb[0] == 2) {
                    pgVar9 = tensor->opt[2];
                    if ((int)pgVar9->nb[0] == 4) {
                      if (pgVar7->ne[0] == uVar25) {
                        uVar28 = pgVar7->ne[1];
                        if (pgVar6->ne[0] == uVar28) {
                          if (pgVar6->ne[1] == 1) {
                            if (pgVar8->ne[0] == uVar28) {
                              if (pgVar8->ne[1] == uVar25) {
                                if (pgVar9->ne[0] == uVar25) {
                                  if (pgVar9->ne[1] == 1) {
                                    if ((int)tensor->nb[0] == 4) {
                                      iVar52 = (int)tensor->nb[1];
                                      if (iVar52 < 4) {
                                        pcVar57 = "nb0 <= nb1";
                                        uVar36 = 0x2106;
                                      }
                                      else {
                                        iVar51 = (int)tensor->nb[2];
                                        if (iVar51 < iVar52) {
                                          pcVar57 = "nb1 <= nb2";
                                          uVar36 = 0x2107;
                                        }
                                        else {
                                          iVar29 = (int)tensor->nb[3];
                                          if (iVar51 <= iVar29) {
                                            if ((params->type & ~GGML_TASK_FINALIZE) ==
                                                GGML_TASK_INIT) {
                                              return;
                                            }
                                            sVar13 = pgVar5->nb[1];
                                            sVar14 = pgVar5->nb[2];
                                            sVar15 = pgVar5->nb[3];
                                            sVar11 = pgVar7->nb[1];
                                            sVar16 = pgVar7->nb[2];
                                            sVar21 = pgVar7->nb[3];
                                            sVar12 = pgVar8->nb[1];
                                            _local_b8 = CONCAT44(uStack_b4,(int)pgVar8->nb[2]);
                                            _i3_1 = CONCAT44(uStack_a4,(int)pgVar8->nb[3]);
                                            iVar55 = pgVar5->ne[2] * iVar27;
                                            iVar53 = pgVar5->ne[3] * iVar55;
                                            iVar26 = (iVar53 + params->nth + -1) / params->nth;
                                            iVar50 = iVar26 * params->ith;
                                            iVar26 = iVar26 + iVar50;
                                            if (iVar53 <= iVar26) {
                                              iVar26 = iVar53;
                                            }
                                            uVar56 = 0;
                                            if (0 < (int)uVar28) {
                                              uVar56 = (ulong)uVar28;
                                            }
                                            uVar4 = 0;
                                            if (0 < (int)uVar25) {
                                              uVar4 = uVar25;
                                            }
                                            local_b0 = (ulong)uVar4;
                                            lVar66 = ((long)(int)(uVar28 * 2) + 0x10) *
                                                     (long)params->ith * 4;
                                            for (; iVar50 < iVar26; iVar50 = iVar50 + 1) {
                                              iVar63 = iVar50 / iVar55;
                                              uVar71 = (ulong)(uint)((int)((long)iVar50 %
                                                                          (long)iVar55) >> 0x1f) <<
                                                       0x20 | (long)iVar50 % (long)iVar55 &
                                                              0xffffffffU;
                                              pfVar45 = (float *)((long)params->wdata + lVar66);
                                              iVar53 = (int)((long)uVar71 / (long)iVar27);
                                              iVar40 = iVar63 * (int)sVar21 + iVar53 * (int)sVar16;
                                              iVar41 = (int)((long)uVar71 % (long)iVar27);
                                              pfVar74 = pfVar45;
                                              uVar71 = uVar56;
                                              while (bVar78 = uVar71 != 0, uVar71 = uVar71 - 1,
                                                    bVar78) {
                                                ggml_vec_dot_f16(uVar25,pfVar74,
                                                                 (ggml_fp16_t *)
                                                                 ((long)pgVar7->data + (long)iVar40)
                                                                 ,(ggml_fp16_t *)
                                                                  ((long)pgVar5->data +
                                                                  (long)(iVar63 * (int)sVar15 +
                                                                         iVar41 * (int)sVar13 +
                                                                        iVar53 * (int)sVar14)));
                                                i1_3 = (int)sVar11;
                                                iVar40 = iVar40 + i1_3;
                                                pfVar74 = pfVar74 + 1;
                                              }
                                              ggml_vec_add_f32(uVar28,pfVar45,pfVar45,
                                                               (float *)pgVar6->data);
                                              pgVar70 = (ggml_fp16_t *)
                                                        ((long)params->wdata +
                                                        (long)(int)uVar28 * 4 + lVar66);
                                              for (uVar71 = 0; uVar56 != uVar71; uVar71 = uVar71 + 1
                                                  ) {
                                                auVar102 = vcvtps2ph_f16c(ZEXT416((uint)pfVar45[
                                                  uVar71]),0);
                                                vpextrw_avx(auVar102,0);
                                              }
                                              for (uVar71 = 0; uVar56 != uVar71; uVar71 = uVar71 + 1
                                                  ) {
                                                pgVar70[uVar71] = table_gelu_f16[pgVar70[uVar71]];
                                              }
                                              iVar41 = iVar63 * iVar29 + iVar53 * iVar51 +
                                                       iVar41 * iVar52;
                                              iVar40 = iVar63 * i3_1 + iVar53 * local_b8;
                                              uVar71 = local_b0;
                                              iVar53 = iVar41;
                                              while( true ) {
                                                bVar78 = uVar71 == 0;
                                                uVar71 = uVar71 - 1;
                                                if (bVar78) break;
                                                ggml_vec_dot_f16(uVar28,(float *)((long)tensor->data
                                                                                 + (long)iVar53),
                                                                 (ggml_fp16_t *)
                                                                 ((long)pgVar8->data + (long)iVar40)
                                                                 ,pgVar70);
                                                local_158 = (int)sVar12;
                                                iVar40 = iVar40 + local_158;
                                                iVar53 = iVar53 + 4;
                                              }
                                              pfVar74 = (float *)((long)tensor->data + (long)iVar41)
                                              ;
                                              ggml_vec_add_f32(uVar25,pfVar74,pfVar74,
                                                               (float *)pgVar9->data);
                                            }
                                            return;
                                          }
                                          pcVar57 = "nb2 <= nb3";
                                          uVar36 = 0x2108;
                                        }
                                      }
                                    }
                                    else {
                                      pcVar57 = "nb0 == sizeof(float)";
                                      uVar36 = 0x2105;
                                    }
                                  }
                                  else {
                                    pcVar57 = "nec11 == 1";
                                    uVar36 = 0x2102;
                                  }
                                }
                                else {
                                  pcVar57 = "nec10 == D";
                                  uVar36 = 0x2101;
                                }
                              }
                              else {
                                pcVar57 = "nec01 == D";
                                uVar36 = 0x2100;
                              }
                            }
                            else {
                              pcVar57 = "nec00 == M";
                              uVar36 = 0x20ff;
                            }
                          }
                          else {
                            pcVar57 = "neb11 == 1";
                            uVar36 = 0x20fd;
                          }
                        }
                        else {
                          pcVar57 = "neb10 == M";
                          uVar36 = 0x20fc;
                        }
                      }
                      else {
                        pcVar57 = "neb00 == D";
                        uVar36 = 0x20fa;
                      }
                    }
                    else {
                      pcVar57 = "nbc10 == sizeof(float)";
                      uVar36 = 0x20f8;
                    }
                  }
                  else {
                    pcVar57 = "nbc00 == sizeof(ggml_fp16_t)";
                    uVar36 = 0x20f7;
                  }
                }
                else {
                  pcVar57 = "nbb10 == sizeof(float)";
                  uVar36 = 0x20f6;
                }
              }
              else {
                pcVar57 = "nbb00 == sizeof(ggml_fp16_t)";
                uVar36 = 0x20f5;
              }
            }
            else {
              pcVar57 = "nba0 == sizeof(ggml_fp16_t)";
              uVar36 = 0x20f4;
            }
          }
          else {
            pcVar57 = "ne2 == nea2";
            uVar36 = 0x20f2;
          }
        }
        else {
          pcVar57 = "ne1 == nea1";
          uVar36 = 0x20f1;
        }
      }
      else {
        pcVar57 = "ne0 == nea0";
        uVar36 = 0x20f0;
      }
      break;
    case GGML_TYPE_F32:
      pcVar57 = "false";
      uVar36 = 0x2165;
      break;
    default:
      goto switchD_0011b7f2_caseD_17;
    }
    goto LAB_00121356;
  case GGML_OP_COUNT:
    pcVar57 = "false";
    uVar36 = 0x220a;
LAB_00121356:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar36,
            pcVar57);
    abort();
  }
switchD_0011b7f2_caseD_17:
  return;
}

Assistant:

static void ggml_compute_forward(struct ggml_compute_params * params, struct ggml_tensor * tensor) {
    GGML_ASSERT(params);

    switch (tensor->op) {
        case GGML_OP_DUP:
            {
                ggml_compute_forward_dup(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ADD:
            {
                ggml_compute_forward_add(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SUB:
            {
                ggml_compute_forward_sub(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_MUL:
            {
                ggml_compute_forward_mul(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_DIV:
            {
                ggml_compute_forward_div(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SQR:
            {
                ggml_compute_forward_sqr(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SQRT:
            {
                ggml_compute_forward_sqrt(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SUM:
            {
                ggml_compute_forward_sum(params, tensor->src0, tensor);
            } break;
        case GGML_OP_MEAN:
            {
                ggml_compute_forward_mean(params, tensor->src0, tensor);
            } break;
        case GGML_OP_REPEAT:
            {
                ggml_compute_forward_repeat(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ABS:
            {
                ggml_compute_forward_abs(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SGN:
            {
                ggml_compute_forward_sgn(params, tensor->src0, tensor);
            } break;
        case GGML_OP_NEG:
            {
                ggml_compute_forward_neg(params, tensor->src0, tensor);
            } break;
        case GGML_OP_STEP:
            {
                ggml_compute_forward_step(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RELU:
            {
                ggml_compute_forward_relu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_GELU:
            {
                ggml_compute_forward_gelu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SILU:
            {
                ggml_compute_forward_silu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_NORM:
            {
                ggml_compute_forward_norm(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RMS_NORM:
            {
                ggml_compute_forward_rms_norm(params, tensor->src0, tensor);
            } break;
        case GGML_OP_MUL_MAT:
            {
                ggml_compute_forward_mul_mat(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SCALE:
            {
                ggml_compute_forward_scale(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CPY:
            {
                ggml_compute_forward_cpy(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RESHAPE:
            {
                ggml_compute_forward_reshape(params, tensor->src0, tensor);
            } break;
        case GGML_OP_VIEW:
            {
                ggml_compute_forward_view(params, tensor->src0);
            } break;
        case GGML_OP_PERMUTE:
            {
                ggml_compute_forward_permute(params, tensor->src0);
            } break;
        case GGML_OP_TRANSPOSE:
            {
                ggml_compute_forward_transpose(params, tensor->src0);
            } break;
        case GGML_OP_GET_ROWS:
            {
                ggml_compute_forward_get_rows(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_DIAG_MASK_INF:
            {
                ggml_compute_forward_diag_mask_inf(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SOFT_MAX:
            {
                ggml_compute_forward_soft_max(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ROPE:
            {
                ggml_compute_forward_rope(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CONV_1D_1S:
            {
                ggml_compute_forward_conv_1d_1s(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CONV_1D_2S:
            {
                ggml_compute_forward_conv_1d_2s(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_FLASH_ATTN:
            {
                int32_t t = ggml_get_i32_1d(tensor->opt[1], 0);
                GGML_ASSERT(t == 0 || t == 1);
                bool masked = t != 0;
                ggml_compute_forward_flash_attn(params, tensor->src0, tensor->src1, tensor->opt[0], masked, tensor);
            } break;
        case GGML_OP_FLASH_FF:
            {
                ggml_compute_forward_flash_ff(params, tensor->src0, tensor->src1, tensor->opt[0], tensor->opt[1], tensor->opt[2], tensor);
            } break;
        case GGML_OP_NONE:
            {
                // nop
            } break;
        case GGML_OP_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}